

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O1

void highbd_set_var_fns(AV1_PRIMARY *ppi)

{
  aom_bit_depth_t aVar1;
  code *pcVar2;
  code *pcVar3;
  code *pcVar4;
  code *pcVar5;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **pp_Var6;
  code *pcVar7;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **pp_Var8;
  code *pcVar9;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **pp_Var10;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **pp_Var11;
  code *pcVar12;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **pp_Var13;
  code *pcVar14;
  aom_masked_sad_fn_t local_448;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_440;
  aom_masked_sad_fn_t local_438;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_430;
  aom_masked_sad_fn_t local_428;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_420;
  aom_masked_sad_fn_t local_418;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_410;
  aom_masked_sad_fn_t local_408;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_400;
  aom_masked_sad_fn_t local_3f8;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_3f0;
  aom_masked_sad_fn_t local_3e8;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_3e0;
  aom_masked_sad_fn_t local_3d8;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_3d0;
  aom_masked_sad_fn_t local_3c8;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_3c0;
  aom_masked_sad_fn_t local_3b8;
  _func_uint32_t_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint32_t_ptr *local_3b0;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_3a8;
  aom_masked_sad_fn_t local_3a0;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_398;
  aom_masked_sad_fn_t local_390;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_388;
  aom_masked_sad_fn_t local_380;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_378;
  aom_masked_sad_fn_t local_370;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_368;
  aom_masked_sad_fn_t local_360;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_358;
  aom_masked_sad_fn_t local_350;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_348;
  aom_masked_sad_fn_t local_340;
  _func_uint_uint8_t_ptr_int_int_int_uint8_t_ptr_int_uint8_t_ptr_uint8_t_ptr_int_int_uint_ptr
  **local_338;
  aom_obmc_sad_fn_t local_330;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_328;
  aom_obmc_subpixvariance_fn_t local_320;
  aom_obmc_sad_fn_t local_318;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_310;
  aom_obmc_subpixvariance_fn_t local_308;
  aom_obmc_sad_fn_t local_300;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_2f8;
  aom_obmc_subpixvariance_fn_t local_2f0;
  aom_obmc_sad_fn_t local_2e8;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_2e0;
  aom_obmc_subpixvariance_fn_t local_2d8;
  aom_obmc_sad_fn_t local_2d0;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_2c8;
  aom_obmc_subpixvariance_fn_t local_2c0;
  aom_obmc_sad_fn_t local_2b8;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_2b0;
  aom_obmc_subpixvariance_fn_t local_2a8;
  aom_obmc_sad_fn_t local_2a0;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_298;
  aom_obmc_subpixvariance_fn_t local_290;
  aom_obmc_sad_fn_t local_288;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_280;
  aom_obmc_subpixvariance_fn_t local_278;
  aom_obmc_sad_fn_t local_270;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_268;
  aom_obmc_subpixvariance_fn_t local_260;
  aom_obmc_sad_fn_t local_258;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_250;
  aom_obmc_subpixvariance_fn_t local_248;
  aom_obmc_sad_fn_t local_240;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_238;
  aom_obmc_subpixvariance_fn_t local_230;
  aom_obmc_sad_fn_t local_228;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_220;
  aom_obmc_subpixvariance_fn_t local_218;
  aom_obmc_sad_fn_t local_210;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_208;
  aom_obmc_subpixvariance_fn_t local_200;
  aom_obmc_sad_fn_t local_1f8;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_1f0;
  aom_obmc_subpixvariance_fn_t local_1e8;
  aom_obmc_sad_fn_t local_1e0;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_1d8;
  aom_obmc_subpixvariance_fn_t local_1d0;
  aom_obmc_sad_fn_t local_1c8;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_1c0;
  aom_obmc_subpixvariance_fn_t local_1b8;
  aom_obmc_sad_fn_t local_1b0;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_1a8;
  aom_obmc_subpixvariance_fn_t local_1a0;
  aom_obmc_sad_fn_t local_198;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_190;
  aom_obmc_subpixvariance_fn_t local_188;
  aom_obmc_sad_fn_t local_180;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_178;
  aom_obmc_subpixvariance_fn_t local_170;
  aom_obmc_sad_fn_t local_168;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_160;
  aom_obmc_subpixvariance_fn_t local_158;
  aom_obmc_sad_fn_t local_150;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_148;
  aom_obmc_subpixvariance_fn_t local_140;
  aom_obmc_sad_fn_t local_138;
  _func_uint_uint8_t_ptr_int_int32_t_ptr_int32_t_ptr_uint_ptr **local_130;
  aom_obmc_subpixvariance_fn_t local_128;
  aom_sad_fn_t local_120;
  aom_sad_multi_d_fn_t local_118;
  aom_sad_fn_t local_110;
  aom_sad_multi_d_fn_t local_108;
  aom_sad_fn_t local_100;
  aom_sad_multi_d_fn_t local_f8;
  aom_sad_fn_t local_f0;
  aom_sad_multi_d_fn_t local_e8;
  aom_sad_fn_t local_e0;
  aom_sad_multi_d_fn_t local_d8;
  aom_sad_fn_t local_d0;
  aom_sad_multi_d_fn_t local_c8;
  aom_sad_fn_t local_c0;
  aom_sad_multi_d_fn_t local_b8;
  aom_sad_fn_t local_b0;
  aom_sad_multi_d_fn_t local_a8;
  aom_sad_fn_t local_a0;
  aom_sad_multi_d_fn_t local_98;
  aom_sad_fn_t local_90;
  aom_sad_multi_d_fn_t local_88;
  aom_sad_fn_t local_80;
  aom_sad_multi_d_fn_t local_78;
  aom_sad_fn_t local_70;
  aom_sad_multi_d_fn_t local_68;
  aom_sad_fn_t local_60;
  aom_sad_multi_d_fn_t local_58;
  aom_sad_fn_t local_50;
  aom_sad_multi_d_fn_t local_48;
  aom_sad_fn_t local_40;
  aom_sad_multi_d_fn_t local_38;
  
  if ((ppi->seq_params).use_highbitdepth != '\0') {
    aVar1 = (ppi->seq_params).bit_depth;
    if (aVar1 == AOM_BITS_12) {
      ppi->fn_ptr[0x15].sdf = aom_highbd_sad64x16_bits12;
      ppi->fn_ptr[0x15].sdaf = aom_highbd_sad64x16_avg_bits12;
      ppi->fn_ptr[0x15].vf = aom_highbd_12_variance64x16_sse2;
      ppi->fn_ptr[0x15].svf = aom_highbd_12_sub_pixel_variance64x16_sse2;
      ppi->fn_ptr[0x15].svaf = aom_highbd_12_sub_pixel_avg_variance64x16_sse2;
      ppi->fn_ptr[0x15].sdx4df = aom_highbd_sad64x16x4d_bits12;
      ppi->fn_ptr[0x15].sdx3df = aom_highbd_sad64x16x3d_bits12;
      ppi->fn_ptr[0x14].sdf = aom_highbd_sad16x64_bits12;
      ppi->fn_ptr[0x14].sdaf = aom_highbd_sad16x64_avg_bits12;
      ppi->fn_ptr[0x14].vf = aom_highbd_12_variance16x64_sse2;
      ppi->fn_ptr[0x14].svf = aom_highbd_12_sub_pixel_variance16x64_sse2;
      ppi->fn_ptr[0x14].svaf = aom_highbd_12_sub_pixel_avg_variance16x64_sse2;
      ppi->fn_ptr[0x14].sdx4df = aom_highbd_sad16x64x4d_bits12;
      ppi->fn_ptr[0x14].sdx3df = aom_highbd_sad16x64x3d_bits12;
      ppi->fn_ptr[0x13].sdf = aom_highbd_sad32x8_bits12;
      ppi->fn_ptr[0x13].sdaf = aom_highbd_sad32x8_avg_bits12;
      ppi->fn_ptr[0x13].vf = aom_highbd_12_variance32x8_sse2;
      ppi->fn_ptr[0x13].svf = aom_highbd_12_sub_pixel_variance32x8_sse2;
      ppi->fn_ptr[0x13].svaf = aom_highbd_12_sub_pixel_avg_variance32x8_sse2;
      ppi->fn_ptr[0x13].sdx4df = aom_highbd_sad32x8x4d_bits12;
      ppi->fn_ptr[0x13].sdx3df = aom_highbd_sad32x8x3d_bits12;
      ppi->fn_ptr[0x12].sdf = aom_highbd_sad8x32_bits12;
      ppi->fn_ptr[0x12].sdaf = aom_highbd_sad8x32_avg_bits12;
      ppi->fn_ptr[0x12].vf = aom_highbd_12_variance8x32_sse2;
      ppi->fn_ptr[0x12].svf = aom_highbd_12_sub_pixel_variance8x32_sse2;
      ppi->fn_ptr[0x12].svaf = aom_highbd_12_sub_pixel_avg_variance8x32_sse2;
      ppi->fn_ptr[0x12].sdx4df = aom_highbd_sad8x32x4d_bits12;
      ppi->fn_ptr[0x12].sdx3df = aom_highbd_sad8x32x3d_bits12;
      ppi->fn_ptr[0x11].sdf = aom_highbd_sad16x4_bits12;
      ppi->fn_ptr[0x11].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0x11].vf = aom_highbd_12_variance16x4_c;
      ppi->fn_ptr[0x11].svf = aom_highbd_12_sub_pixel_variance16x4_sse2;
      ppi->fn_ptr[0x11].svaf = aom_highbd_12_sub_pixel_avg_variance16x4_sse2;
      ppi->fn_ptr[0x11].sdx4df = aom_highbd_sad16x4x4d_bits12;
      ppi->fn_ptr[0x11].sdx3df = aom_highbd_sad16x4x3d_bits12;
      ppi->fn_ptr[0x10].sdf = aom_highbd_sad4x16_bits12;
      ppi->fn_ptr[0x10].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0x10].vf = aom_highbd_12_variance4x16_c;
      ppi->fn_ptr[0x10].svf = aom_highbd_12_sub_pixel_variance4x16_c;
      ppi->fn_ptr[0x10].svaf = aom_highbd_12_sub_pixel_avg_variance4x16_c;
      ppi->fn_ptr[0x10].sdx4df = aom_highbd_sad4x16x4d_bits12;
      ppi->fn_ptr[0x10].sdx3df = aom_highbd_sad4x16x3d_bits12;
      ppi->fn_ptr[8].sdf = aom_highbd_sad32x16_bits12;
      ppi->fn_ptr[8].sdaf = aom_highbd_sad32x16_avg_bits12;
      ppi->fn_ptr[8].vf = aom_highbd_12_variance32x16_sse2;
      ppi->fn_ptr[8].svf = aom_highbd_12_sub_pixel_variance32x16_sse2;
      ppi->fn_ptr[8].svaf = aom_highbd_12_sub_pixel_avg_variance32x16_sse2;
      ppi->fn_ptr[8].sdx4df = aom_highbd_sad32x16x4d_bits12;
      ppi->fn_ptr[8].sdx3df = aom_highbd_sad32x16x3d_bits12;
      ppi->fn_ptr[7].sdf = aom_highbd_sad16x32_bits12;
      ppi->fn_ptr[7].sdaf = aom_highbd_sad16x32_avg_bits12;
      ppi->fn_ptr[7].vf = aom_highbd_12_variance16x32_sse2;
      ppi->fn_ptr[7].svf = aom_highbd_12_sub_pixel_variance16x32_sse2;
      ppi->fn_ptr[7].svaf = aom_highbd_12_sub_pixel_avg_variance16x32_sse2;
      ppi->fn_ptr[7].sdx4df = aom_highbd_sad16x32x4d_bits12;
      ppi->fn_ptr[7].sdx3df = aom_highbd_sad16x32x3d_bits12;
      ppi->fn_ptr[0xb].sdf = aom_highbd_sad64x32_bits12;
      ppi->fn_ptr[0xb].sdaf = aom_highbd_sad64x32_avg_bits12;
      ppi->fn_ptr[0xb].vf = aom_highbd_12_variance64x32_sse2;
      ppi->fn_ptr[0xb].svf = aom_highbd_12_sub_pixel_variance64x32_sse2;
      ppi->fn_ptr[0xb].svaf = aom_highbd_12_sub_pixel_avg_variance64x32_sse2;
      ppi->fn_ptr[0xb].sdx4df = aom_highbd_sad64x32x4d_bits12;
      ppi->fn_ptr[0xb].sdx3df = aom_highbd_sad64x32x3d_bits12;
      ppi->fn_ptr[10].sdf = aom_highbd_sad32x64_bits12;
      ppi->fn_ptr[10].sdaf = aom_highbd_sad32x64_avg_bits12;
      ppi->fn_ptr[10].vf = aom_highbd_12_variance32x64_sse2;
      ppi->fn_ptr[10].svf = aom_highbd_12_sub_pixel_variance32x64_sse2;
      ppi->fn_ptr[10].svaf = aom_highbd_12_sub_pixel_avg_variance32x64_sse2;
      ppi->fn_ptr[10].sdx4df = aom_highbd_sad32x64x4d_bits12;
      ppi->fn_ptr[10].sdx3df = aom_highbd_sad32x64x3d_bits12;
      ppi->fn_ptr[9].sdf = aom_highbd_sad32x32_bits12;
      ppi->fn_ptr[9].sdaf = aom_highbd_sad32x32_avg_bits12;
      ppi->fn_ptr[9].vf = aom_highbd_12_variance32x32_sse2;
      ppi->fn_ptr[9].svf = aom_highbd_12_sub_pixel_variance32x32_sse2;
      ppi->fn_ptr[9].svaf = aom_highbd_12_sub_pixel_avg_variance32x32_sse2;
      ppi->fn_ptr[9].sdx4df = aom_highbd_sad32x32x4d_bits12;
      ppi->fn_ptr[9].sdx3df = aom_highbd_sad32x32x3d_bits12;
      ppi->fn_ptr[0xc].sdf = aom_highbd_sad64x64_bits12;
      ppi->fn_ptr[0xc].sdaf = aom_highbd_sad64x64_avg_bits12;
      ppi->fn_ptr[0xc].vf = aom_highbd_12_variance64x64_sse2;
      ppi->fn_ptr[0xc].svf = aom_highbd_12_sub_pixel_variance64x64_sse2;
      ppi->fn_ptr[0xc].svaf = aom_highbd_12_sub_pixel_avg_variance64x64_sse2;
      ppi->fn_ptr[0xc].sdx4df = aom_highbd_sad64x64x4d_bits12;
      ppi->fn_ptr[0xc].sdx3df = aom_highbd_sad64x64x3d_bits12;
      ppi->fn_ptr[6].sdf = aom_highbd_sad16x16_bits12;
      ppi->fn_ptr[6].sdaf = aom_highbd_sad16x16_avg_bits12;
      ppi->fn_ptr[6].vf = aom_highbd_12_variance16x16_sse2;
      ppi->fn_ptr[6].svf = aom_highbd_12_sub_pixel_variance16x16_sse2;
      ppi->fn_ptr[6].svaf = aom_highbd_12_sub_pixel_avg_variance16x16_sse2;
      ppi->fn_ptr[6].sdx4df = aom_highbd_sad16x16x4d_bits12;
      ppi->fn_ptr[6].sdx3df = aom_highbd_sad16x16x3d_bits12;
      ppi->fn_ptr[5].sdf = aom_highbd_sad16x8_bits12;
      ppi->fn_ptr[5].sdaf = aom_highbd_sad16x8_avg_bits12;
      ppi->fn_ptr[5].vf = aom_highbd_12_variance16x8_sse2;
      ppi->fn_ptr[5].svf = aom_highbd_12_sub_pixel_variance16x8_sse2;
      ppi->fn_ptr[5].svaf = aom_highbd_12_sub_pixel_avg_variance16x8_sse2;
      ppi->fn_ptr[5].sdx4df = aom_highbd_sad16x8x4d_bits12;
      ppi->fn_ptr[5].sdx3df = aom_highbd_sad16x8x3d_bits12;
      ppi->fn_ptr[4].sdf = aom_highbd_sad8x16_bits12;
      ppi->fn_ptr[4].sdaf = aom_highbd_sad8x16_avg_bits12;
      ppi->fn_ptr[4].vf = aom_highbd_12_variance8x16_sse2;
      ppi->fn_ptr[4].svf = aom_highbd_12_sub_pixel_variance8x16_sse2;
      ppi->fn_ptr[4].svaf = aom_highbd_12_sub_pixel_avg_variance8x16_sse2;
      ppi->fn_ptr[4].sdx4df = aom_highbd_sad8x16x4d_bits12;
      ppi->fn_ptr[4].sdx3df = aom_highbd_sad8x16x3d_bits12;
      ppi->fn_ptr[3].sdf = aom_highbd_sad8x8_bits12;
      ppi->fn_ptr[3].sdaf = aom_highbd_sad8x8_avg_bits12;
      ppi->fn_ptr[3].vf = aom_highbd_12_variance8x8_sse2;
      ppi->fn_ptr[3].svf = aom_highbd_12_sub_pixel_variance8x8_sse2;
      ppi->fn_ptr[3].svaf = aom_highbd_12_sub_pixel_avg_variance8x8_sse2;
      ppi->fn_ptr[3].sdx4df = aom_highbd_sad8x8x4d_bits12;
      ppi->fn_ptr[3].sdx3df = aom_highbd_sad8x8x3d_bits12;
      ppi->fn_ptr[2].sdf = aom_highbd_sad8x4_bits12;
      ppi->fn_ptr[2].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[2].vf = aom_highbd_12_variance8x4_c;
      ppi->fn_ptr[2].svf = aom_highbd_12_sub_pixel_variance8x4_sse2;
      ppi->fn_ptr[2].svaf = aom_highbd_12_sub_pixel_avg_variance8x4_sse2;
      ppi->fn_ptr[2].sdx4df = aom_highbd_sad8x4x4d_bits12;
      ppi->fn_ptr[2].sdx3df = aom_highbd_sad8x4x3d_bits12;
      ppi->fn_ptr[1].sdf = aom_highbd_sad4x8_bits12;
      ppi->fn_ptr[1].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[1].vf = aom_highbd_12_variance4x8_c;
      ppi->fn_ptr[1].svf = aom_highbd_12_sub_pixel_variance4x8_c;
      ppi->fn_ptr[1].svaf = aom_highbd_12_sub_pixel_avg_variance4x8_c;
      ppi->fn_ptr[1].sdx4df = aom_highbd_sad4x8x4d_bits12;
      ppi->fn_ptr[1].sdx3df = aom_highbd_sad4x8x3d_bits12;
      ppi->fn_ptr[0].sdf = aom_highbd_sad4x4_bits12;
      ppi->fn_ptr[0].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0].vf = (aom_variance_fn_t)aom_highbd_12_variance4x4;
      ppi->fn_ptr[0].svf = (aom_subpixvariance_fn_t)aom_highbd_12_sub_pixel_variance4x4;
      ppi->fn_ptr[0].svaf = (aom_subp_avg_variance_fn_t)aom_highbd_12_sub_pixel_avg_variance4x4;
      ppi->fn_ptr[0].sdx4df = aom_highbd_sad4x4x4d_bits12;
      ppi->fn_ptr[0].sdx3df = aom_highbd_sad4x4x3d_bits12;
      ppi->fn_ptr[0xf].sdf = aom_highbd_sad128x128_bits12;
      ppi->fn_ptr[0xf].sdaf = aom_highbd_sad128x128_avg_bits12;
      ppi->fn_ptr[0xf].vf = aom_highbd_12_variance128x128_sse2;
      ppi->fn_ptr[0xf].svf = aom_highbd_12_sub_pixel_variance128x128_sse2;
      ppi->fn_ptr[0xf].svaf = aom_highbd_12_sub_pixel_avg_variance128x128_c;
      ppi->fn_ptr[0xf].sdx4df = aom_highbd_sad128x128x4d_bits12;
      ppi->fn_ptr[0xf].sdx3df = aom_highbd_sad128x128x3d_bits12;
      ppi->fn_ptr[0xe].sdf = aom_highbd_sad128x64_bits12;
      ppi->fn_ptr[0xe].sdaf = aom_highbd_sad128x64_avg_bits12;
      ppi->fn_ptr[0xe].vf = aom_highbd_12_variance128x64_sse2;
      ppi->fn_ptr[0xe].svf = aom_highbd_12_sub_pixel_variance128x64_sse2;
      ppi->fn_ptr[0xe].svaf = aom_highbd_12_sub_pixel_avg_variance128x64_c;
      ppi->fn_ptr[0xe].sdx4df = aom_highbd_sad128x64x4d_bits12;
      ppi->fn_ptr[0xe].sdx3df = aom_highbd_sad128x64x3d_bits12;
      ppi->fn_ptr[0xd].sdf = aom_highbd_sad64x128_bits12;
      ppi->fn_ptr[0xd].sdaf = aom_highbd_sad64x128_avg_bits12;
      ppi->fn_ptr[0xd].vf = aom_highbd_12_variance64x128_sse2;
      local_38 = aom_highbd_sad_skip_4x16x4d_bits12;
      local_40 = aom_highbd_sad_skip_4x16_bits12;
      local_48 = aom_highbd_sad_skip_8x32x4d_bits12;
      local_50 = aom_highbd_sad_skip_8x32_bits12;
      local_58 = aom_highbd_sad_skip_16x64x4d_bits12;
      local_60 = aom_highbd_sad_skip_16x64_bits12;
      local_68 = aom_highbd_sad_skip_64x16x4d_bits12;
      local_70 = aom_highbd_sad_skip_64x16_bits12;
      local_78 = aom_highbd_sad_skip_8x16x4d_bits12;
      local_80 = aom_highbd_sad_skip_8x16_bits12;
      local_88 = aom_highbd_sad_skip_16x16x4d_bits12;
      local_90 = aom_highbd_sad_skip_16x16_bits12;
      local_98 = aom_highbd_sad_skip_16x32x4d_bits12;
      local_a0 = aom_highbd_sad_skip_16x32_bits12;
      local_a8 = aom_highbd_sad_skip_32x16x4d_bits12;
      local_b0 = aom_highbd_sad_skip_32x16_bits12;
      local_b8 = aom_highbd_sad_skip_32x32x4d_bits12;
      local_c0 = aom_highbd_sad_skip_32x32_bits12;
      local_c8 = aom_highbd_sad_skip_32x64x4d_bits12;
      local_d0 = aom_highbd_sad_skip_32x64_bits12;
      local_d8 = aom_highbd_sad_skip_64x32x4d_bits12;
      local_e0 = aom_highbd_sad_skip_64x32_bits12;
      local_e8 = aom_highbd_sad_skip_64x64x4d_bits12;
      local_f0 = aom_highbd_sad_skip_64x64_bits12;
      local_f8 = aom_highbd_sad_skip_64x128x4d_bits12;
      local_100 = aom_highbd_sad_skip_64x128_bits12;
      local_108 = aom_highbd_sad_skip_128x64x4d_bits12;
      local_110 = aom_highbd_sad_skip_128x64_bits12;
      local_118 = aom_highbd_sad_skip_128x128x4d_bits12;
      local_120 = aom_highbd_sad_skip_128x128_bits12;
      local_128 = aom_highbd_12_obmc_sub_pixel_variance4x16_c;
      local_130 = &aom_highbd_12_obmc_variance4x16;
      local_138 = aom_highbd_obmc_sad4x16_bits12;
      local_140 = aom_highbd_12_obmc_sub_pixel_variance16x4_c;
      local_148 = &aom_highbd_12_obmc_variance16x4;
      local_150 = aom_highbd_obmc_sad16x4_bits12;
      local_158 = aom_highbd_12_obmc_sub_pixel_variance8x32_c;
      local_160 = &aom_highbd_12_obmc_variance8x32;
      local_168 = aom_highbd_obmc_sad8x32_bits12;
      local_170 = aom_highbd_12_obmc_sub_pixel_variance32x8_c;
      local_178 = &aom_highbd_12_obmc_variance32x8;
      local_180 = aom_highbd_obmc_sad32x8_bits12;
      local_188 = aom_highbd_12_obmc_sub_pixel_variance16x64_c;
      local_190 = &aom_highbd_12_obmc_variance16x64;
      local_198 = aom_highbd_obmc_sad16x64_bits12;
      local_1a0 = aom_highbd_12_obmc_sub_pixel_variance64x16_c;
      local_1a8 = &aom_highbd_12_obmc_variance64x16;
      local_1b0 = aom_highbd_obmc_sad64x16_bits12;
      local_1b8 = aom_highbd_12_obmc_sub_pixel_variance4x4_c;
      local_1c0 = &aom_highbd_12_obmc_variance4x4;
      local_1c8 = aom_highbd_obmc_sad4x4_bits12;
      local_1d0 = aom_highbd_12_obmc_sub_pixel_variance8x4_c;
      local_1d8 = &aom_highbd_12_obmc_variance8x4;
      local_1e0 = aom_highbd_obmc_sad8x4_bits12;
      local_1e8 = aom_highbd_12_obmc_sub_pixel_variance4x8_c;
      local_1f0 = &aom_highbd_12_obmc_variance4x8;
      local_1f8 = aom_highbd_obmc_sad4x8_bits12;
      local_200 = aom_highbd_12_obmc_sub_pixel_variance8x8_c;
      local_208 = &aom_highbd_12_obmc_variance8x8;
      local_210 = aom_highbd_obmc_sad8x8_bits12;
      local_218 = aom_highbd_12_obmc_sub_pixel_variance16x8_c;
      local_220 = &aom_highbd_12_obmc_variance16x8;
      local_228 = aom_highbd_obmc_sad16x8_bits12;
      local_230 = aom_highbd_12_obmc_sub_pixel_variance8x16_c;
      local_238 = &aom_highbd_12_obmc_variance8x16;
      local_240 = aom_highbd_obmc_sad8x16_bits12;
      local_248 = aom_highbd_12_obmc_sub_pixel_variance16x16_c;
      local_250 = &aom_highbd_12_obmc_variance16x16;
      local_258 = aom_highbd_obmc_sad16x16_bits12;
      local_260 = aom_highbd_12_obmc_sub_pixel_variance16x32_c;
      local_268 = &aom_highbd_12_obmc_variance16x32;
      local_270 = aom_highbd_obmc_sad16x32_bits12;
      local_278 = aom_highbd_12_obmc_sub_pixel_variance32x16_c;
      local_280 = &aom_highbd_12_obmc_variance32x16;
      local_288 = aom_highbd_obmc_sad32x16_bits12;
      local_290 = aom_highbd_12_obmc_sub_pixel_variance32x32_c;
      local_298 = &aom_highbd_12_obmc_variance32x32;
      local_2a0 = aom_highbd_obmc_sad32x32_bits12;
      local_2a8 = aom_highbd_12_obmc_sub_pixel_variance32x64_c;
      local_2b0 = &aom_highbd_12_obmc_variance32x64;
      local_2b8 = aom_highbd_obmc_sad32x64_bits12;
      local_2c0 = aom_highbd_12_obmc_sub_pixel_variance64x32_c;
      local_2c8 = &aom_highbd_12_obmc_variance64x32;
      local_2d0 = aom_highbd_obmc_sad64x32_bits12;
      local_2d8 = aom_highbd_12_obmc_sub_pixel_variance64x64_c;
      local_2e0 = &aom_highbd_12_obmc_variance64x64;
      local_2e8 = aom_highbd_obmc_sad64x64_bits12;
      local_2f0 = aom_highbd_12_obmc_sub_pixel_variance64x128_c;
      local_2f8 = &aom_highbd_12_obmc_variance64x128;
      local_300 = aom_highbd_obmc_sad64x128_bits12;
      local_308 = aom_highbd_12_obmc_sub_pixel_variance128x64_c;
      local_310 = &aom_highbd_12_obmc_variance128x64;
      local_318 = aom_highbd_obmc_sad128x64_bits12;
      local_320 = aom_highbd_12_obmc_sub_pixel_variance128x128_c;
      local_328 = &aom_highbd_12_obmc_variance128x128;
      local_330 = aom_highbd_obmc_sad128x128_bits12;
      local_338 = &aom_highbd_12_masked_sub_pixel_variance4x16;
      local_340 = aom_highbd_masked_sad4x16_bits12;
      local_348 = &aom_highbd_12_masked_sub_pixel_variance16x4;
      local_350 = aom_highbd_masked_sad16x4_bits12;
      local_358 = &aom_highbd_12_masked_sub_pixel_variance8x32;
      local_360 = aom_highbd_masked_sad8x32_bits12;
      local_368 = &aom_highbd_12_masked_sub_pixel_variance32x8;
      local_370 = aom_highbd_masked_sad32x8_bits12;
      local_378 = &aom_highbd_12_masked_sub_pixel_variance16x64;
      local_380 = aom_highbd_masked_sad16x64_bits12;
      local_388 = &aom_highbd_12_masked_sub_pixel_variance64x16;
      local_390 = aom_highbd_masked_sad64x16_bits12;
      local_398 = &aom_highbd_12_masked_sub_pixel_variance4x4;
      local_3a0 = aom_highbd_masked_sad4x4_bits12;
      local_3a8 = &aom_highbd_12_masked_sub_pixel_variance8x4;
      local_3b8 = aom_highbd_masked_sad8x4_bits12;
      local_3c0 = &aom_highbd_12_masked_sub_pixel_variance4x8;
      local_3c8 = aom_highbd_masked_sad4x8_bits12;
      local_3d0 = &aom_highbd_12_masked_sub_pixel_variance8x8;
      local_3d8 = aom_highbd_masked_sad8x8_bits12;
      local_3e0 = &aom_highbd_12_masked_sub_pixel_variance16x8;
      local_3e8 = aom_highbd_masked_sad16x8_bits12;
      local_3f0 = &aom_highbd_12_masked_sub_pixel_variance8x16;
      local_3f8 = aom_highbd_masked_sad8x16_bits12;
      local_400 = &aom_highbd_12_masked_sub_pixel_variance16x16;
      local_408 = aom_highbd_masked_sad16x16_bits12;
      local_410 = &aom_highbd_12_masked_sub_pixel_variance16x32;
      local_418 = aom_highbd_masked_sad16x32_bits12;
      local_420 = &aom_highbd_12_masked_sub_pixel_variance32x16;
      local_428 = aom_highbd_masked_sad32x16_bits12;
      local_430 = &aom_highbd_12_masked_sub_pixel_variance32x32;
      local_438 = aom_highbd_masked_sad32x32_bits12;
      local_440 = &aom_highbd_12_masked_sub_pixel_variance32x64;
      local_448 = aom_highbd_masked_sad32x64_bits12;
      pp_Var8 = &aom_highbd_12_masked_sub_pixel_variance64x32;
      pcVar9 = aom_highbd_masked_sad64x32_bits12;
      pp_Var10 = &aom_highbd_12_masked_sub_pixel_variance64x64;
      pcVar5 = aom_highbd_masked_sad64x64_bits12;
      pp_Var13 = &aom_highbd_12_masked_sub_pixel_variance64x128;
      pcVar14 = aom_highbd_masked_sad64x128_bits12;
      pp_Var11 = &aom_highbd_12_masked_sub_pixel_variance128x64;
      pcVar12 = aom_highbd_masked_sad128x64_bits12;
      pp_Var6 = &aom_highbd_12_masked_sub_pixel_variance128x128;
      pcVar2 = aom_highbd_masked_sad128x128_bits12;
      pcVar3 = aom_highbd_sad64x128x3d_bits12;
      pcVar4 = aom_highbd_sad64x128x4d_bits12;
      pcVar7 = aom_highbd_12_sub_pixel_avg_variance64x128_c;
      local_3b0 = aom_highbd_12_sub_pixel_variance64x128_sse2;
    }
    else if (aVar1 == AOM_BITS_10) {
      ppi->fn_ptr[0x15].sdf = aom_highbd_sad64x16_bits10;
      ppi->fn_ptr[0x15].sdaf = aom_highbd_sad64x16_avg_bits10;
      ppi->fn_ptr[0x15].vf = (aom_variance_fn_t)aom_highbd_10_variance64x16;
      ppi->fn_ptr[0x15].svf = aom_highbd_10_sub_pixel_variance64x16_sse2;
      ppi->fn_ptr[0x15].svaf = aom_highbd_10_sub_pixel_avg_variance64x16_sse2;
      ppi->fn_ptr[0x15].sdx4df = aom_highbd_sad64x16x4d_bits10;
      ppi->fn_ptr[0x15].sdx3df = aom_highbd_sad64x16x3d_bits10;
      ppi->fn_ptr[0x14].sdf = aom_highbd_sad16x64_bits10;
      ppi->fn_ptr[0x14].sdaf = aom_highbd_sad16x64_avg_bits10;
      ppi->fn_ptr[0x14].vf = (aom_variance_fn_t)aom_highbd_10_variance16x64;
      ppi->fn_ptr[0x14].svf = aom_highbd_10_sub_pixel_variance16x64_sse2;
      ppi->fn_ptr[0x14].svaf = aom_highbd_10_sub_pixel_avg_variance16x64_sse2;
      ppi->fn_ptr[0x14].sdx4df = aom_highbd_sad16x64x4d_bits10;
      ppi->fn_ptr[0x14].sdx3df = aom_highbd_sad16x64x3d_bits10;
      ppi->fn_ptr[0x13].sdf = aom_highbd_sad32x8_bits10;
      ppi->fn_ptr[0x13].sdaf = aom_highbd_sad32x8_avg_bits10;
      ppi->fn_ptr[0x13].vf = (aom_variance_fn_t)aom_highbd_10_variance32x8;
      ppi->fn_ptr[0x13].svf = aom_highbd_10_sub_pixel_variance32x8_sse2;
      ppi->fn_ptr[0x13].svaf = aom_highbd_10_sub_pixel_avg_variance32x8_sse2;
      ppi->fn_ptr[0x13].sdx4df = aom_highbd_sad32x8x4d_bits10;
      ppi->fn_ptr[0x13].sdx3df = aom_highbd_sad32x8x3d_bits10;
      ppi->fn_ptr[0x12].sdf = aom_highbd_sad8x32_bits10;
      ppi->fn_ptr[0x12].sdaf = aom_highbd_sad8x32_avg_bits10;
      ppi->fn_ptr[0x12].vf = (aom_variance_fn_t)aom_highbd_10_variance8x32;
      ppi->fn_ptr[0x12].svf = aom_highbd_10_sub_pixel_variance8x32_sse2;
      ppi->fn_ptr[0x12].svaf = aom_highbd_10_sub_pixel_avg_variance8x32_sse2;
      ppi->fn_ptr[0x12].sdx4df = aom_highbd_sad8x32x4d_bits10;
      ppi->fn_ptr[0x12].sdx3df = aom_highbd_sad8x32x3d_bits10;
      ppi->fn_ptr[0x11].sdf = aom_highbd_sad16x4_bits10;
      ppi->fn_ptr[0x11].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0x11].vf = aom_highbd_10_variance16x4_c;
      ppi->fn_ptr[0x11].svf = aom_highbd_10_sub_pixel_variance16x4_sse2;
      ppi->fn_ptr[0x11].svaf = aom_highbd_10_sub_pixel_avg_variance16x4_sse2;
      ppi->fn_ptr[0x11].sdx4df = aom_highbd_sad16x4x4d_bits10;
      ppi->fn_ptr[0x11].sdx3df = aom_highbd_sad16x4x3d_bits10;
      ppi->fn_ptr[0x10].sdf = aom_highbd_sad4x16_bits10;
      ppi->fn_ptr[0x10].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0x10].vf = aom_highbd_10_variance4x16_c;
      ppi->fn_ptr[0x10].svf = aom_highbd_10_sub_pixel_variance4x16_c;
      ppi->fn_ptr[0x10].svaf = aom_highbd_10_sub_pixel_avg_variance4x16_c;
      ppi->fn_ptr[0x10].sdx4df = aom_highbd_sad4x16x4d_bits10;
      ppi->fn_ptr[0x10].sdx3df = aom_highbd_sad4x16x3d_bits10;
      ppi->fn_ptr[8].sdf = aom_highbd_sad32x16_bits10;
      ppi->fn_ptr[8].sdaf = aom_highbd_sad32x16_avg_bits10;
      ppi->fn_ptr[8].vf = (aom_variance_fn_t)aom_highbd_10_variance32x16;
      ppi->fn_ptr[8].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance32x16;
      ppi->fn_ptr[8].svaf = aom_highbd_10_sub_pixel_avg_variance32x16_sse2;
      ppi->fn_ptr[8].sdx4df = aom_highbd_sad32x16x4d_bits10;
      ppi->fn_ptr[8].sdx3df = aom_highbd_sad32x16x3d_bits10;
      ppi->fn_ptr[7].sdf = aom_highbd_sad16x32_bits10;
      ppi->fn_ptr[7].sdaf = aom_highbd_sad16x32_avg_bits10;
      ppi->fn_ptr[7].vf = (aom_variance_fn_t)aom_highbd_10_variance16x32;
      ppi->fn_ptr[7].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance16x32;
      ppi->fn_ptr[7].svaf = aom_highbd_10_sub_pixel_avg_variance16x32_sse2;
      ppi->fn_ptr[7].sdx4df = aom_highbd_sad16x32x4d_bits10;
      ppi->fn_ptr[7].sdx3df = aom_highbd_sad16x32x3d_bits10;
      ppi->fn_ptr[0xb].sdf = aom_highbd_sad64x32_bits10;
      ppi->fn_ptr[0xb].sdaf = aom_highbd_sad64x32_avg_bits10;
      ppi->fn_ptr[0xb].vf = (aom_variance_fn_t)aom_highbd_10_variance64x32;
      ppi->fn_ptr[0xb].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance64x32;
      ppi->fn_ptr[0xb].svaf = aom_highbd_10_sub_pixel_avg_variance64x32_sse2;
      ppi->fn_ptr[0xb].sdx4df = aom_highbd_sad64x32x4d_bits10;
      ppi->fn_ptr[0xb].sdx3df = aom_highbd_sad64x32x3d_bits10;
      ppi->fn_ptr[10].sdf = aom_highbd_sad32x64_bits10;
      ppi->fn_ptr[10].sdaf = aom_highbd_sad32x64_avg_bits10;
      ppi->fn_ptr[10].vf = (aom_variance_fn_t)aom_highbd_10_variance32x64;
      ppi->fn_ptr[10].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance32x64;
      ppi->fn_ptr[10].svaf = aom_highbd_10_sub_pixel_avg_variance32x64_sse2;
      ppi->fn_ptr[10].sdx4df = aom_highbd_sad32x64x4d_bits10;
      ppi->fn_ptr[10].sdx3df = aom_highbd_sad32x64x3d_bits10;
      ppi->fn_ptr[9].sdf = aom_highbd_sad32x32_bits10;
      ppi->fn_ptr[9].sdaf = aom_highbd_sad32x32_avg_bits10;
      ppi->fn_ptr[9].vf = (aom_variance_fn_t)aom_highbd_10_variance32x32;
      ppi->fn_ptr[9].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance32x32;
      ppi->fn_ptr[9].svaf = aom_highbd_10_sub_pixel_avg_variance32x32_sse2;
      ppi->fn_ptr[9].sdx4df = aom_highbd_sad32x32x4d_bits10;
      ppi->fn_ptr[9].sdx3df = aom_highbd_sad32x32x3d_bits10;
      ppi->fn_ptr[0xc].sdf = aom_highbd_sad64x64_bits10;
      ppi->fn_ptr[0xc].sdaf = aom_highbd_sad64x64_avg_bits10;
      ppi->fn_ptr[0xc].vf = (aom_variance_fn_t)aom_highbd_10_variance64x64;
      ppi->fn_ptr[0xc].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance64x64;
      ppi->fn_ptr[0xc].svaf = aom_highbd_10_sub_pixel_avg_variance64x64_sse2;
      ppi->fn_ptr[0xc].sdx4df = aom_highbd_sad64x64x4d_bits10;
      ppi->fn_ptr[0xc].sdx3df = aom_highbd_sad64x64x3d_bits10;
      ppi->fn_ptr[6].sdf = aom_highbd_sad16x16_bits10;
      ppi->fn_ptr[6].sdaf = aom_highbd_sad16x16_avg_bits10;
      ppi->fn_ptr[6].vf = (aom_variance_fn_t)aom_highbd_10_variance16x16;
      ppi->fn_ptr[6].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance16x16;
      ppi->fn_ptr[6].svaf = aom_highbd_10_sub_pixel_avg_variance16x16_sse2;
      ppi->fn_ptr[6].sdx4df = aom_highbd_sad16x16x4d_bits10;
      ppi->fn_ptr[6].sdx3df = aom_highbd_sad16x16x3d_bits10;
      ppi->fn_ptr[5].sdf = aom_highbd_sad16x8_bits10;
      ppi->fn_ptr[5].sdaf = aom_highbd_sad16x8_avg_bits10;
      ppi->fn_ptr[5].vf = (aom_variance_fn_t)aom_highbd_10_variance16x8;
      ppi->fn_ptr[5].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance16x8;
      ppi->fn_ptr[5].svaf = aom_highbd_10_sub_pixel_avg_variance16x8_sse2;
      ppi->fn_ptr[5].sdx4df = aom_highbd_sad16x8x4d_bits10;
      ppi->fn_ptr[5].sdx3df = aom_highbd_sad16x8x3d_bits10;
      ppi->fn_ptr[4].sdf = aom_highbd_sad8x16_bits10;
      ppi->fn_ptr[4].sdaf = aom_highbd_sad8x16_avg_bits10;
      ppi->fn_ptr[4].vf = (aom_variance_fn_t)aom_highbd_10_variance8x16;
      ppi->fn_ptr[4].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance8x16;
      ppi->fn_ptr[4].svaf = aom_highbd_10_sub_pixel_avg_variance8x16_sse2;
      ppi->fn_ptr[4].sdx4df = aom_highbd_sad8x16x4d_bits10;
      ppi->fn_ptr[4].sdx3df = aom_highbd_sad8x16x3d_bits10;
      ppi->fn_ptr[3].sdf = aom_highbd_sad8x8_bits10;
      ppi->fn_ptr[3].sdaf = aom_highbd_sad8x8_avg_bits10;
      ppi->fn_ptr[3].vf = (aom_variance_fn_t)aom_highbd_10_variance8x8;
      ppi->fn_ptr[3].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance8x8;
      ppi->fn_ptr[3].svaf = aom_highbd_10_sub_pixel_avg_variance8x8_sse2;
      ppi->fn_ptr[3].sdx4df = aom_highbd_sad8x8x4d_bits10;
      ppi->fn_ptr[3].sdx3df = aom_highbd_sad8x8x3d_bits10;
      ppi->fn_ptr[2].sdf = aom_highbd_sad8x4_bits10;
      ppi->fn_ptr[2].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[2].vf = aom_highbd_10_variance8x4_c;
      ppi->fn_ptr[2].svf = aom_highbd_10_sub_pixel_variance8x4_sse2;
      ppi->fn_ptr[2].svaf = aom_highbd_10_sub_pixel_avg_variance8x4_sse2;
      ppi->fn_ptr[2].sdx4df = aom_highbd_sad8x4x4d_bits10;
      ppi->fn_ptr[2].sdx3df = aom_highbd_sad8x4x3d_bits10;
      ppi->fn_ptr[1].sdf = aom_highbd_sad4x8_bits10;
      ppi->fn_ptr[1].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[1].vf = aom_highbd_10_variance4x8_c;
      ppi->fn_ptr[1].svf = aom_highbd_10_sub_pixel_variance4x8_c;
      ppi->fn_ptr[1].svaf = aom_highbd_10_sub_pixel_avg_variance4x8_c;
      ppi->fn_ptr[1].sdx4df = aom_highbd_sad4x8x4d_bits10;
      ppi->fn_ptr[1].sdx3df = aom_highbd_sad4x8x3d_bits10;
      ppi->fn_ptr[0].sdf = aom_highbd_sad4x4_bits10;
      ppi->fn_ptr[0].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0].vf = (aom_variance_fn_t)aom_highbd_10_variance4x4;
      ppi->fn_ptr[0].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance4x4;
      ppi->fn_ptr[0].svaf = (aom_subp_avg_variance_fn_t)aom_highbd_10_sub_pixel_avg_variance4x4;
      ppi->fn_ptr[0].sdx4df = aom_highbd_sad4x4x4d_bits10;
      ppi->fn_ptr[0].sdx3df = aom_highbd_sad4x4x3d_bits10;
      ppi->fn_ptr[0xf].sdf = aom_highbd_sad128x128_bits10;
      ppi->fn_ptr[0xf].sdaf = aom_highbd_sad128x128_avg_bits10;
      ppi->fn_ptr[0xf].vf = (aom_variance_fn_t)aom_highbd_10_variance128x128;
      ppi->fn_ptr[0xf].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance128x128;
      ppi->fn_ptr[0xf].svaf = aom_highbd_10_sub_pixel_avg_variance128x128_c;
      ppi->fn_ptr[0xf].sdx4df = aom_highbd_sad128x128x4d_bits10;
      ppi->fn_ptr[0xf].sdx3df = aom_highbd_sad128x128x3d_bits10;
      ppi->fn_ptr[0xe].sdf = aom_highbd_sad128x64_bits10;
      ppi->fn_ptr[0xe].sdaf = aom_highbd_sad128x64_avg_bits10;
      ppi->fn_ptr[0xe].vf = (aom_variance_fn_t)aom_highbd_10_variance128x64;
      ppi->fn_ptr[0xe].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance128x64;
      ppi->fn_ptr[0xe].svaf = aom_highbd_10_sub_pixel_avg_variance128x64_c;
      ppi->fn_ptr[0xe].sdx4df = aom_highbd_sad128x64x4d_bits10;
      ppi->fn_ptr[0xe].sdx3df = aom_highbd_sad128x64x3d_bits10;
      ppi->fn_ptr[0xd].sdf = aom_highbd_sad64x128_bits10;
      ppi->fn_ptr[0xd].sdaf = aom_highbd_sad64x128_avg_bits10;
      ppi->fn_ptr[0xd].vf = (aom_variance_fn_t)aom_highbd_10_variance64x128;
      local_3b0 = aom_highbd_10_sub_pixel_variance64x128;
      local_38 = aom_highbd_sad_skip_4x16x4d_bits10;
      local_40 = aom_highbd_sad_skip_4x16_bits10;
      local_48 = aom_highbd_sad_skip_8x32x4d_bits10;
      local_50 = aom_highbd_sad_skip_8x32_bits10;
      local_58 = aom_highbd_sad_skip_16x64x4d_bits10;
      local_60 = aom_highbd_sad_skip_16x64_bits10;
      local_68 = aom_highbd_sad_skip_64x16x4d_bits10;
      local_70 = aom_highbd_sad_skip_64x16_bits10;
      local_78 = aom_highbd_sad_skip_8x16x4d_bits10;
      local_80 = aom_highbd_sad_skip_8x16_bits10;
      local_88 = aom_highbd_sad_skip_16x16x4d_bits10;
      local_90 = aom_highbd_sad_skip_16x16_bits10;
      local_98 = aom_highbd_sad_skip_16x32x4d_bits10;
      local_a0 = aom_highbd_sad_skip_16x32_bits10;
      local_a8 = aom_highbd_sad_skip_32x16x4d_bits10;
      local_b0 = aom_highbd_sad_skip_32x16_bits10;
      local_b8 = aom_highbd_sad_skip_32x32x4d_bits10;
      local_c0 = aom_highbd_sad_skip_32x32_bits10;
      local_c8 = aom_highbd_sad_skip_32x64x4d_bits10;
      local_d0 = aom_highbd_sad_skip_32x64_bits10;
      local_d8 = aom_highbd_sad_skip_64x32x4d_bits10;
      local_e0 = aom_highbd_sad_skip_64x32_bits10;
      local_e8 = aom_highbd_sad_skip_64x64x4d_bits10;
      local_f0 = aom_highbd_sad_skip_64x64_bits10;
      local_f8 = aom_highbd_sad_skip_64x128x4d_bits10;
      local_100 = aom_highbd_sad_skip_64x128_bits10;
      local_108 = aom_highbd_sad_skip_128x64x4d_bits10;
      local_110 = aom_highbd_sad_skip_128x64_bits10;
      local_118 = aom_highbd_sad_skip_128x128x4d_bits10;
      local_120 = aom_highbd_sad_skip_128x128_bits10;
      local_128 = aom_highbd_10_obmc_sub_pixel_variance4x16_c;
      local_130 = &aom_highbd_10_obmc_variance4x16;
      local_138 = aom_highbd_obmc_sad4x16_bits10;
      local_140 = aom_highbd_10_obmc_sub_pixel_variance16x4_c;
      local_148 = &aom_highbd_10_obmc_variance16x4;
      local_150 = aom_highbd_obmc_sad16x4_bits10;
      local_158 = aom_highbd_10_obmc_sub_pixel_variance8x32_c;
      local_160 = &aom_highbd_10_obmc_variance8x32;
      local_168 = aom_highbd_obmc_sad8x32_bits10;
      local_170 = aom_highbd_10_obmc_sub_pixel_variance32x8_c;
      local_178 = &aom_highbd_10_obmc_variance32x8;
      local_180 = aom_highbd_obmc_sad32x8_bits10;
      local_188 = aom_highbd_10_obmc_sub_pixel_variance16x64_c;
      local_190 = &aom_highbd_10_obmc_variance16x64;
      local_198 = aom_highbd_obmc_sad16x64_bits10;
      local_1a0 = aom_highbd_10_obmc_sub_pixel_variance64x16_c;
      local_1a8 = &aom_highbd_10_obmc_variance64x16;
      local_1b0 = aom_highbd_obmc_sad64x16_bits10;
      local_1b8 = aom_highbd_10_obmc_sub_pixel_variance4x4_c;
      local_1c0 = &aom_highbd_10_obmc_variance4x4;
      local_1c8 = aom_highbd_obmc_sad4x4_bits10;
      local_1d0 = aom_highbd_10_obmc_sub_pixel_variance8x4_c;
      local_1d8 = &aom_highbd_10_obmc_variance8x4;
      local_1e0 = aom_highbd_obmc_sad8x4_bits10;
      local_1e8 = aom_highbd_10_obmc_sub_pixel_variance4x8_c;
      local_1f0 = &aom_highbd_10_obmc_variance4x8;
      local_1f8 = aom_highbd_obmc_sad4x8_bits10;
      local_200 = aom_highbd_10_obmc_sub_pixel_variance8x8_c;
      local_208 = &aom_highbd_10_obmc_variance8x8;
      local_210 = aom_highbd_obmc_sad8x8_bits10;
      local_218 = aom_highbd_10_obmc_sub_pixel_variance16x8_c;
      local_220 = &aom_highbd_10_obmc_variance16x8;
      local_228 = aom_highbd_obmc_sad16x8_bits10;
      local_230 = aom_highbd_10_obmc_sub_pixel_variance8x16_c;
      local_238 = &aom_highbd_10_obmc_variance8x16;
      local_240 = aom_highbd_obmc_sad8x16_bits10;
      local_248 = aom_highbd_10_obmc_sub_pixel_variance16x16_c;
      local_250 = &aom_highbd_10_obmc_variance16x16;
      local_258 = aom_highbd_obmc_sad16x16_bits10;
      local_260 = aom_highbd_10_obmc_sub_pixel_variance16x32_c;
      local_268 = &aom_highbd_10_obmc_variance16x32;
      local_270 = aom_highbd_obmc_sad16x32_bits10;
      local_278 = aom_highbd_10_obmc_sub_pixel_variance32x16_c;
      local_280 = &aom_highbd_10_obmc_variance32x16;
      local_288 = aom_highbd_obmc_sad32x16_bits10;
      local_290 = aom_highbd_10_obmc_sub_pixel_variance32x32_c;
      local_298 = &aom_highbd_10_obmc_variance32x32;
      local_2a0 = aom_highbd_obmc_sad32x32_bits10;
      local_2a8 = aom_highbd_10_obmc_sub_pixel_variance32x64_c;
      local_2b0 = &aom_highbd_10_obmc_variance32x64;
      local_2b8 = aom_highbd_obmc_sad32x64_bits10;
      local_2c0 = aom_highbd_10_obmc_sub_pixel_variance64x32_c;
      local_2c8 = &aom_highbd_10_obmc_variance64x32;
      local_2d0 = aom_highbd_obmc_sad64x32_bits10;
      local_2d8 = aom_highbd_10_obmc_sub_pixel_variance64x64_c;
      local_2e0 = &aom_highbd_10_obmc_variance64x64;
      local_2e8 = aom_highbd_obmc_sad64x64_bits10;
      local_2f0 = aom_highbd_10_obmc_sub_pixel_variance64x128_c;
      local_2f8 = &aom_highbd_10_obmc_variance64x128;
      local_300 = aom_highbd_obmc_sad64x128_bits10;
      local_308 = aom_highbd_10_obmc_sub_pixel_variance128x64_c;
      local_310 = &aom_highbd_10_obmc_variance128x64;
      local_318 = aom_highbd_obmc_sad128x64_bits10;
      local_320 = aom_highbd_10_obmc_sub_pixel_variance128x128_c;
      local_328 = &aom_highbd_10_obmc_variance128x128;
      local_330 = aom_highbd_obmc_sad128x128_bits10;
      local_338 = &aom_highbd_10_masked_sub_pixel_variance4x16;
      local_340 = aom_highbd_masked_sad4x16_bits10;
      local_348 = &aom_highbd_10_masked_sub_pixel_variance16x4;
      local_350 = aom_highbd_masked_sad16x4_bits10;
      local_358 = &aom_highbd_10_masked_sub_pixel_variance8x32;
      local_360 = aom_highbd_masked_sad8x32_bits10;
      local_368 = &aom_highbd_10_masked_sub_pixel_variance32x8;
      local_370 = aom_highbd_masked_sad32x8_bits10;
      local_378 = &aom_highbd_10_masked_sub_pixel_variance16x64;
      local_380 = aom_highbd_masked_sad16x64_bits10;
      local_388 = &aom_highbd_10_masked_sub_pixel_variance64x16;
      local_390 = aom_highbd_masked_sad64x16_bits10;
      local_398 = &aom_highbd_10_masked_sub_pixel_variance4x4;
      local_3a0 = aom_highbd_masked_sad4x4_bits10;
      local_3a8 = &aom_highbd_10_masked_sub_pixel_variance8x4;
      local_3b8 = aom_highbd_masked_sad8x4_bits10;
      local_3c0 = &aom_highbd_10_masked_sub_pixel_variance4x8;
      local_3c8 = aom_highbd_masked_sad4x8_bits10;
      local_3d0 = &aom_highbd_10_masked_sub_pixel_variance8x8;
      local_3d8 = aom_highbd_masked_sad8x8_bits10;
      local_3e0 = &aom_highbd_10_masked_sub_pixel_variance16x8;
      local_3e8 = aom_highbd_masked_sad16x8_bits10;
      local_3f0 = &aom_highbd_10_masked_sub_pixel_variance8x16;
      local_3f8 = aom_highbd_masked_sad8x16_bits10;
      local_400 = &aom_highbd_10_masked_sub_pixel_variance16x16;
      local_408 = aom_highbd_masked_sad16x16_bits10;
      local_410 = &aom_highbd_10_masked_sub_pixel_variance16x32;
      local_418 = aom_highbd_masked_sad16x32_bits10;
      local_420 = &aom_highbd_10_masked_sub_pixel_variance32x16;
      local_428 = aom_highbd_masked_sad32x16_bits10;
      local_430 = &aom_highbd_10_masked_sub_pixel_variance32x32;
      local_438 = aom_highbd_masked_sad32x32_bits10;
      local_440 = &aom_highbd_10_masked_sub_pixel_variance32x64;
      local_448 = aom_highbd_masked_sad32x64_bits10;
      pp_Var8 = &aom_highbd_10_masked_sub_pixel_variance64x32;
      pcVar9 = aom_highbd_masked_sad64x32_bits10;
      pp_Var10 = &aom_highbd_10_masked_sub_pixel_variance64x64;
      pcVar5 = aom_highbd_masked_sad64x64_bits10;
      pp_Var13 = &aom_highbd_10_masked_sub_pixel_variance64x128;
      pcVar14 = aom_highbd_masked_sad64x128_bits10;
      pp_Var11 = &aom_highbd_10_masked_sub_pixel_variance128x64;
      pcVar12 = aom_highbd_masked_sad128x64_bits10;
      pp_Var6 = &aom_highbd_10_masked_sub_pixel_variance128x128;
      pcVar2 = aom_highbd_masked_sad128x128_bits10;
      pcVar3 = aom_highbd_sad64x128x3d_bits10;
      pcVar4 = aom_highbd_sad64x128x4d_bits10;
      pcVar7 = aom_highbd_10_sub_pixel_avg_variance64x128_c;
    }
    else {
      if (aVar1 != AOM_BITS_8) {
        return;
      }
      ppi->fn_ptr[0x15].sdf = aom_highbd_sad64x16_bits8;
      ppi->fn_ptr[0x15].sdaf = aom_highbd_sad64x16_avg_bits8;
      ppi->fn_ptr[0x15].vf = aom_highbd_8_variance64x16_sse2;
      ppi->fn_ptr[0x15].svf = aom_highbd_8_sub_pixel_variance64x16_sse2;
      ppi->fn_ptr[0x15].svaf = aom_highbd_8_sub_pixel_avg_variance64x16_sse2;
      ppi->fn_ptr[0x15].sdx4df = aom_highbd_sad64x16x4d_bits8;
      ppi->fn_ptr[0x15].sdx3df = aom_highbd_sad64x16x3d_bits8;
      ppi->fn_ptr[0x14].sdf = aom_highbd_sad16x64_bits8;
      ppi->fn_ptr[0x14].sdaf = aom_highbd_sad16x64_avg_bits8;
      ppi->fn_ptr[0x14].vf = aom_highbd_8_variance16x64_sse2;
      ppi->fn_ptr[0x14].svf = aom_highbd_8_sub_pixel_variance16x64_sse2;
      ppi->fn_ptr[0x14].svaf = aom_highbd_8_sub_pixel_avg_variance16x64_sse2;
      ppi->fn_ptr[0x14].sdx4df = aom_highbd_sad16x64x4d_bits8;
      ppi->fn_ptr[0x14].sdx3df = aom_highbd_sad16x64x3d_bits8;
      ppi->fn_ptr[0x13].sdf = aom_highbd_sad32x8_bits8;
      ppi->fn_ptr[0x13].sdaf = aom_highbd_sad32x8_avg_bits8;
      ppi->fn_ptr[0x13].vf = aom_highbd_8_variance32x8_sse2;
      ppi->fn_ptr[0x13].svf = aom_highbd_8_sub_pixel_variance32x8_sse2;
      ppi->fn_ptr[0x13].svaf = aom_highbd_8_sub_pixel_avg_variance32x8_sse2;
      ppi->fn_ptr[0x13].sdx4df = aom_highbd_sad32x8x4d_bits8;
      ppi->fn_ptr[0x13].sdx3df = aom_highbd_sad32x8x3d_bits8;
      ppi->fn_ptr[0x12].sdf = aom_highbd_sad8x32_bits8;
      ppi->fn_ptr[0x12].sdaf = aom_highbd_sad8x32_avg_bits8;
      ppi->fn_ptr[0x12].vf = aom_highbd_8_variance8x32_sse2;
      ppi->fn_ptr[0x12].svf = aom_highbd_8_sub_pixel_variance8x32_sse2;
      ppi->fn_ptr[0x12].svaf = aom_highbd_8_sub_pixel_avg_variance8x32_sse2;
      ppi->fn_ptr[0x12].sdx4df = aom_highbd_sad8x32x4d_bits8;
      ppi->fn_ptr[0x12].sdx3df = aom_highbd_sad8x32x3d_bits8;
      ppi->fn_ptr[0x11].sdf = aom_highbd_sad16x4_bits8;
      ppi->fn_ptr[0x11].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0x11].vf = aom_highbd_8_variance16x4_c;
      ppi->fn_ptr[0x11].svf = aom_highbd_8_sub_pixel_variance16x4_sse2;
      ppi->fn_ptr[0x11].svaf = aom_highbd_8_sub_pixel_avg_variance16x4_sse2;
      ppi->fn_ptr[0x11].sdx4df = aom_highbd_sad16x4x4d_bits8;
      ppi->fn_ptr[0x11].sdx3df = aom_highbd_sad16x4x3d_bits8;
      ppi->fn_ptr[0x10].sdf = aom_highbd_sad4x16_bits8;
      ppi->fn_ptr[0x10].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0x10].vf = aom_highbd_8_variance4x16_c;
      ppi->fn_ptr[0x10].svf = aom_highbd_8_sub_pixel_variance4x16_c;
      ppi->fn_ptr[0x10].svaf = aom_highbd_8_sub_pixel_avg_variance4x16_c;
      ppi->fn_ptr[0x10].sdx4df = aom_highbd_sad4x16x4d_bits8;
      ppi->fn_ptr[0x10].sdx3df = aom_highbd_sad4x16x3d_bits8;
      ppi->fn_ptr[8].sdf = aom_highbd_sad32x16_bits8;
      ppi->fn_ptr[8].sdaf = aom_highbd_sad32x16_avg_bits8;
      ppi->fn_ptr[8].vf = aom_highbd_8_variance32x16_sse2;
      ppi->fn_ptr[8].svf = aom_highbd_8_sub_pixel_variance32x16_sse2;
      ppi->fn_ptr[8].svaf = aom_highbd_8_sub_pixel_avg_variance32x16_sse2;
      ppi->fn_ptr[8].sdx4df = aom_highbd_sad32x16x4d_bits8;
      ppi->fn_ptr[8].sdx3df = aom_highbd_sad32x16x3d_bits8;
      ppi->fn_ptr[7].sdf = aom_highbd_sad16x32_bits8;
      ppi->fn_ptr[7].sdaf = aom_highbd_sad16x32_avg_bits8;
      ppi->fn_ptr[7].vf = aom_highbd_8_variance16x32_sse2;
      ppi->fn_ptr[7].svf = aom_highbd_8_sub_pixel_variance16x32_sse2;
      ppi->fn_ptr[7].svaf = aom_highbd_8_sub_pixel_avg_variance16x32_sse2;
      ppi->fn_ptr[7].sdx4df = aom_highbd_sad16x32x4d_bits8;
      ppi->fn_ptr[7].sdx3df = aom_highbd_sad16x32x3d_bits8;
      ppi->fn_ptr[0xb].sdf = aom_highbd_sad64x32_bits8;
      ppi->fn_ptr[0xb].sdaf = aom_highbd_sad64x32_avg_bits8;
      ppi->fn_ptr[0xb].vf = aom_highbd_8_variance64x32_sse2;
      ppi->fn_ptr[0xb].svf = aom_highbd_8_sub_pixel_variance64x32_sse2;
      ppi->fn_ptr[0xb].svaf = aom_highbd_8_sub_pixel_avg_variance64x32_sse2;
      ppi->fn_ptr[0xb].sdx4df = aom_highbd_sad64x32x4d_bits8;
      ppi->fn_ptr[0xb].sdx3df = aom_highbd_sad64x32x3d_bits8;
      ppi->fn_ptr[10].sdf = aom_highbd_sad32x64_bits8;
      ppi->fn_ptr[10].sdaf = aom_highbd_sad32x64_avg_bits8;
      ppi->fn_ptr[10].vf = aom_highbd_8_variance32x64_sse2;
      ppi->fn_ptr[10].svf = aom_highbd_8_sub_pixel_variance32x64_sse2;
      ppi->fn_ptr[10].svaf = aom_highbd_8_sub_pixel_avg_variance32x64_sse2;
      ppi->fn_ptr[10].sdx4df = aom_highbd_sad32x64x4d_bits8;
      ppi->fn_ptr[10].sdx3df = aom_highbd_sad32x64x3d_bits8;
      ppi->fn_ptr[9].sdf = aom_highbd_sad32x32_bits8;
      ppi->fn_ptr[9].sdaf = aom_highbd_sad32x32_avg_bits8;
      ppi->fn_ptr[9].vf = aom_highbd_8_variance32x32_sse2;
      ppi->fn_ptr[9].svf = aom_highbd_8_sub_pixel_variance32x32_sse2;
      ppi->fn_ptr[9].svaf = aom_highbd_8_sub_pixel_avg_variance32x32_sse2;
      ppi->fn_ptr[9].sdx4df = aom_highbd_sad32x32x4d_bits8;
      ppi->fn_ptr[9].sdx3df = aom_highbd_sad32x32x3d_bits8;
      ppi->fn_ptr[0xc].sdf = aom_highbd_sad64x64_bits8;
      ppi->fn_ptr[0xc].sdaf = aom_highbd_sad64x64_avg_bits8;
      ppi->fn_ptr[0xc].vf = aom_highbd_8_variance64x64_sse2;
      ppi->fn_ptr[0xc].svf = aom_highbd_8_sub_pixel_variance64x64_sse2;
      ppi->fn_ptr[0xc].svaf = aom_highbd_8_sub_pixel_avg_variance64x64_sse2;
      ppi->fn_ptr[0xc].sdx4df = aom_highbd_sad64x64x4d_bits8;
      ppi->fn_ptr[0xc].sdx3df = aom_highbd_sad64x64x3d_bits8;
      ppi->fn_ptr[6].sdf = aom_highbd_sad16x16_bits8;
      ppi->fn_ptr[6].sdaf = aom_highbd_sad16x16_avg_bits8;
      ppi->fn_ptr[6].vf = aom_highbd_8_variance16x16_sse2;
      ppi->fn_ptr[6].svf = aom_highbd_8_sub_pixel_variance16x16_sse2;
      ppi->fn_ptr[6].svaf = aom_highbd_8_sub_pixel_avg_variance16x16_sse2;
      ppi->fn_ptr[6].sdx4df = aom_highbd_sad16x16x4d_bits8;
      ppi->fn_ptr[6].sdx3df = aom_highbd_sad16x16x3d_bits8;
      ppi->fn_ptr[5].sdf = aom_highbd_sad16x8_bits8;
      ppi->fn_ptr[5].sdaf = aom_highbd_sad16x8_avg_bits8;
      ppi->fn_ptr[5].vf = aom_highbd_8_variance16x8_sse2;
      ppi->fn_ptr[5].svf = aom_highbd_8_sub_pixel_variance16x8_sse2;
      ppi->fn_ptr[5].svaf = aom_highbd_8_sub_pixel_avg_variance16x8_sse2;
      ppi->fn_ptr[5].sdx4df = aom_highbd_sad16x8x4d_bits8;
      ppi->fn_ptr[5].sdx3df = aom_highbd_sad16x8x3d_bits8;
      ppi->fn_ptr[4].sdf = aom_highbd_sad8x16_bits8;
      ppi->fn_ptr[4].sdaf = aom_highbd_sad8x16_avg_bits8;
      ppi->fn_ptr[4].vf = aom_highbd_8_variance8x16_sse2;
      ppi->fn_ptr[4].svf = aom_highbd_8_sub_pixel_variance8x16_sse2;
      ppi->fn_ptr[4].svaf = aom_highbd_8_sub_pixel_avg_variance8x16_sse2;
      ppi->fn_ptr[4].sdx4df = aom_highbd_sad8x16x4d_bits8;
      ppi->fn_ptr[4].sdx3df = aom_highbd_sad8x16x3d_bits8;
      ppi->fn_ptr[3].sdf = aom_highbd_sad8x8_bits8;
      ppi->fn_ptr[3].sdaf = aom_highbd_sad8x8_avg_bits8;
      ppi->fn_ptr[3].vf = aom_highbd_8_variance8x8_sse2;
      ppi->fn_ptr[3].svf = aom_highbd_8_sub_pixel_variance8x8_sse2;
      ppi->fn_ptr[3].svaf = aom_highbd_8_sub_pixel_avg_variance8x8_sse2;
      ppi->fn_ptr[3].sdx4df = aom_highbd_sad8x8x4d_bits8;
      ppi->fn_ptr[3].sdx3df = aom_highbd_sad8x8x3d_bits8;
      ppi->fn_ptr[2].sdf = aom_highbd_sad8x4_bits8;
      ppi->fn_ptr[2].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[2].vf = aom_highbd_8_variance8x4_c;
      ppi->fn_ptr[2].svf = aom_highbd_8_sub_pixel_variance8x4_sse2;
      ppi->fn_ptr[2].svaf = aom_highbd_8_sub_pixel_avg_variance8x4_sse2;
      ppi->fn_ptr[2].sdx4df = aom_highbd_sad8x4x4d_bits8;
      ppi->fn_ptr[2].sdx3df = aom_highbd_sad8x4x3d_bits8;
      ppi->fn_ptr[1].sdf = aom_highbd_sad4x8_bits8;
      ppi->fn_ptr[1].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[1].vf = aom_highbd_8_variance4x8_c;
      ppi->fn_ptr[1].svf = aom_highbd_8_sub_pixel_variance4x8_c;
      ppi->fn_ptr[1].svaf = aom_highbd_8_sub_pixel_avg_variance4x8_c;
      ppi->fn_ptr[1].sdx4df = aom_highbd_sad4x8x4d_bits8;
      ppi->fn_ptr[1].sdx3df = aom_highbd_sad4x8x3d_bits8;
      ppi->fn_ptr[0].sdf = aom_highbd_sad4x4_bits8;
      ppi->fn_ptr[0].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0].vf = (aom_variance_fn_t)aom_highbd_8_variance4x4;
      ppi->fn_ptr[0].svf = (aom_subpixvariance_fn_t)aom_highbd_8_sub_pixel_variance4x4;
      ppi->fn_ptr[0].svaf = (aom_subp_avg_variance_fn_t)aom_highbd_8_sub_pixel_avg_variance4x4;
      ppi->fn_ptr[0].sdx4df = aom_highbd_sad4x4x4d_bits8;
      ppi->fn_ptr[0].sdx3df = aom_highbd_sad4x4x3d_bits8;
      ppi->fn_ptr[0xf].sdf = aom_highbd_sad128x128_bits8;
      ppi->fn_ptr[0xf].sdaf = aom_highbd_sad128x128_avg_bits8;
      ppi->fn_ptr[0xf].vf = aom_highbd_8_variance128x128_sse2;
      ppi->fn_ptr[0xf].svf = aom_highbd_8_sub_pixel_variance128x128_sse2;
      ppi->fn_ptr[0xf].svaf = aom_highbd_8_sub_pixel_avg_variance128x128_c;
      ppi->fn_ptr[0xf].sdx4df = aom_highbd_sad128x128x4d_bits8;
      ppi->fn_ptr[0xf].sdx3df = aom_highbd_sad128x128x3d_bits8;
      ppi->fn_ptr[0xe].sdf = aom_highbd_sad128x64_bits8;
      ppi->fn_ptr[0xe].sdaf = aom_highbd_sad128x64_avg_bits8;
      ppi->fn_ptr[0xe].vf = aom_highbd_8_variance128x64_sse2;
      ppi->fn_ptr[0xe].svf = aom_highbd_8_sub_pixel_variance128x64_sse2;
      ppi->fn_ptr[0xe].svaf = aom_highbd_8_sub_pixel_avg_variance128x64_c;
      ppi->fn_ptr[0xe].sdx4df = aom_highbd_sad128x64x4d_bits8;
      ppi->fn_ptr[0xe].sdx3df = aom_highbd_sad128x64x3d_bits8;
      ppi->fn_ptr[0xd].sdf = aom_highbd_sad64x128_bits8;
      ppi->fn_ptr[0xd].sdaf = aom_highbd_sad64x128_avg_bits8;
      ppi->fn_ptr[0xd].vf = aom_highbd_8_variance64x128_sse2;
      local_38 = aom_highbd_sad_skip_4x16x4d_bits8;
      local_40 = aom_highbd_sad_skip_4x16_bits8;
      local_48 = aom_highbd_sad_skip_8x32x4d_bits8;
      local_50 = aom_highbd_sad_skip_8x32_bits8;
      local_58 = aom_highbd_sad_skip_16x64x4d_bits8;
      local_60 = aom_highbd_sad_skip_16x64_bits8;
      local_68 = aom_highbd_sad_skip_64x16x4d_bits8;
      local_70 = aom_highbd_sad_skip_64x16_bits8;
      local_78 = aom_highbd_sad_skip_8x16x4d_bits8;
      local_80 = aom_highbd_sad_skip_8x16_bits8;
      local_88 = aom_highbd_sad_skip_16x16x4d_bits8;
      local_90 = aom_highbd_sad_skip_16x16_bits8;
      local_98 = aom_highbd_sad_skip_16x32x4d_bits8;
      local_a0 = aom_highbd_sad_skip_16x32_bits8;
      local_a8 = aom_highbd_sad_skip_32x16x4d_bits8;
      local_b0 = aom_highbd_sad_skip_32x16_bits8;
      local_b8 = aom_highbd_sad_skip_32x32x4d_bits8;
      local_c0 = aom_highbd_sad_skip_32x32_bits8;
      local_c8 = aom_highbd_sad_skip_32x64x4d_bits8;
      local_d0 = aom_highbd_sad_skip_32x64_bits8;
      local_d8 = aom_highbd_sad_skip_64x32x4d_bits8;
      local_e0 = aom_highbd_sad_skip_64x32_bits8;
      local_e8 = aom_highbd_sad_skip_64x64x4d_bits8;
      local_f0 = aom_highbd_sad_skip_64x64_bits8;
      local_f8 = aom_highbd_sad_skip_64x128x4d_bits8;
      local_100 = aom_highbd_sad_skip_64x128_bits8;
      local_108 = aom_highbd_sad_skip_128x64x4d_bits8;
      local_110 = aom_highbd_sad_skip_128x64_bits8;
      local_118 = aom_highbd_sad_skip_128x128x4d_bits8;
      local_120 = aom_highbd_sad_skip_128x128_bits8;
      local_128 = aom_highbd_8_obmc_sub_pixel_variance4x16_c;
      local_130 = &aom_highbd_8_obmc_variance4x16;
      local_138 = aom_highbd_obmc_sad4x16_bits8;
      local_140 = aom_highbd_8_obmc_sub_pixel_variance16x4_c;
      local_148 = &aom_highbd_8_obmc_variance16x4;
      local_150 = aom_highbd_obmc_sad16x4_bits8;
      local_158 = aom_highbd_8_obmc_sub_pixel_variance8x32_c;
      local_160 = &aom_highbd_8_obmc_variance8x32;
      local_168 = aom_highbd_obmc_sad8x32_bits8;
      local_170 = aom_highbd_8_obmc_sub_pixel_variance32x8_c;
      local_178 = &aom_highbd_8_obmc_variance32x8;
      local_180 = aom_highbd_obmc_sad32x8_bits8;
      local_188 = aom_highbd_8_obmc_sub_pixel_variance16x64_c;
      local_190 = &aom_highbd_8_obmc_variance16x64;
      local_198 = aom_highbd_obmc_sad16x64_bits8;
      local_1a0 = aom_highbd_8_obmc_sub_pixel_variance64x16_c;
      local_1a8 = &aom_highbd_8_obmc_variance64x16;
      local_1b0 = aom_highbd_obmc_sad64x16_bits8;
      local_1b8 = aom_highbd_8_obmc_sub_pixel_variance4x4_c;
      local_1c0 = &aom_highbd_8_obmc_variance4x4;
      local_1c8 = aom_highbd_obmc_sad4x4_bits8;
      local_1d0 = aom_highbd_8_obmc_sub_pixel_variance8x4_c;
      local_1d8 = &aom_highbd_8_obmc_variance8x4;
      local_1e0 = aom_highbd_obmc_sad8x4_bits8;
      local_1e8 = aom_highbd_8_obmc_sub_pixel_variance4x8_c;
      local_1f0 = &aom_highbd_8_obmc_variance4x8;
      local_1f8 = aom_highbd_obmc_sad4x8_bits8;
      local_200 = aom_highbd_8_obmc_sub_pixel_variance8x8_c;
      local_208 = &aom_highbd_8_obmc_variance8x8;
      local_210 = aom_highbd_obmc_sad8x8_bits8;
      local_218 = aom_highbd_8_obmc_sub_pixel_variance16x8_c;
      local_220 = &aom_highbd_8_obmc_variance16x8;
      local_228 = aom_highbd_obmc_sad16x8_bits8;
      local_230 = aom_highbd_8_obmc_sub_pixel_variance8x16_c;
      local_238 = &aom_highbd_8_obmc_variance8x16;
      local_240 = aom_highbd_obmc_sad8x16_bits8;
      local_248 = aom_highbd_8_obmc_sub_pixel_variance16x16_c;
      local_250 = &aom_highbd_8_obmc_variance16x16;
      local_258 = aom_highbd_obmc_sad16x16_bits8;
      local_260 = aom_highbd_8_obmc_sub_pixel_variance16x32_c;
      local_268 = &aom_highbd_8_obmc_variance16x32;
      local_270 = aom_highbd_obmc_sad16x32_bits8;
      local_278 = aom_highbd_8_obmc_sub_pixel_variance32x16_c;
      local_280 = &aom_highbd_8_obmc_variance32x16;
      local_288 = aom_highbd_obmc_sad32x16_bits8;
      local_290 = aom_highbd_8_obmc_sub_pixel_variance32x32_c;
      local_298 = &aom_highbd_8_obmc_variance32x32;
      local_2a0 = aom_highbd_obmc_sad32x32_bits8;
      local_2a8 = aom_highbd_8_obmc_sub_pixel_variance32x64_c;
      local_2b0 = &aom_highbd_8_obmc_variance32x64;
      local_2b8 = aom_highbd_obmc_sad32x64_bits8;
      local_2c0 = aom_highbd_8_obmc_sub_pixel_variance64x32_c;
      local_2c8 = &aom_highbd_8_obmc_variance64x32;
      local_2d0 = aom_highbd_obmc_sad64x32_bits8;
      local_2d8 = aom_highbd_8_obmc_sub_pixel_variance64x64_c;
      local_2e0 = &aom_highbd_8_obmc_variance64x64;
      local_2e8 = aom_highbd_obmc_sad64x64_bits8;
      local_2f0 = aom_highbd_8_obmc_sub_pixel_variance64x128_c;
      local_2f8 = &aom_highbd_8_obmc_variance64x128;
      local_300 = aom_highbd_obmc_sad64x128_bits8;
      local_308 = aom_highbd_8_obmc_sub_pixel_variance128x64_c;
      local_310 = &aom_highbd_8_obmc_variance128x64;
      local_318 = aom_highbd_obmc_sad128x64_bits8;
      local_320 = aom_highbd_8_obmc_sub_pixel_variance128x128_c;
      local_328 = &aom_highbd_8_obmc_variance128x128;
      local_330 = aom_highbd_obmc_sad128x128_bits8;
      local_338 = &aom_highbd_8_masked_sub_pixel_variance4x16;
      local_340 = aom_highbd_masked_sad4x16_bits8;
      local_348 = &aom_highbd_8_masked_sub_pixel_variance16x4;
      local_350 = aom_highbd_masked_sad16x4_bits8;
      local_358 = &aom_highbd_8_masked_sub_pixel_variance8x32;
      local_360 = aom_highbd_masked_sad8x32_bits8;
      local_368 = &aom_highbd_8_masked_sub_pixel_variance32x8;
      local_370 = aom_highbd_masked_sad32x8_bits8;
      local_378 = &aom_highbd_8_masked_sub_pixel_variance16x64;
      local_380 = aom_highbd_masked_sad16x64_bits8;
      local_388 = &aom_highbd_8_masked_sub_pixel_variance64x16;
      local_390 = aom_highbd_masked_sad64x16_bits8;
      local_398 = &aom_highbd_8_masked_sub_pixel_variance4x4;
      local_3a0 = aom_highbd_masked_sad4x4_bits8;
      local_3a8 = &aom_highbd_8_masked_sub_pixel_variance8x4;
      local_3b8 = aom_highbd_masked_sad8x4_bits8;
      local_3c0 = &aom_highbd_8_masked_sub_pixel_variance4x8;
      local_3c8 = aom_highbd_masked_sad4x8_bits8;
      local_3d0 = &aom_highbd_8_masked_sub_pixel_variance8x8;
      local_3d8 = aom_highbd_masked_sad8x8_bits8;
      local_3e0 = &aom_highbd_8_masked_sub_pixel_variance16x8;
      local_3e8 = aom_highbd_masked_sad16x8_bits8;
      local_3f0 = &aom_highbd_8_masked_sub_pixel_variance8x16;
      local_3f8 = aom_highbd_masked_sad8x16_bits8;
      local_400 = &aom_highbd_8_masked_sub_pixel_variance16x16;
      local_408 = aom_highbd_masked_sad16x16_bits8;
      local_410 = &aom_highbd_8_masked_sub_pixel_variance16x32;
      local_418 = aom_highbd_masked_sad16x32_bits8;
      local_420 = &aom_highbd_8_masked_sub_pixel_variance32x16;
      local_428 = aom_highbd_masked_sad32x16_bits8;
      local_430 = &aom_highbd_8_masked_sub_pixel_variance32x32;
      local_438 = aom_highbd_masked_sad32x32_bits8;
      local_440 = &aom_highbd_8_masked_sub_pixel_variance32x64;
      local_448 = aom_highbd_masked_sad32x64_bits8;
      pp_Var8 = &aom_highbd_8_masked_sub_pixel_variance64x32;
      pcVar9 = aom_highbd_masked_sad64x32_bits8;
      pp_Var10 = &aom_highbd_8_masked_sub_pixel_variance64x64;
      pcVar5 = aom_highbd_masked_sad64x64_bits8;
      pp_Var13 = &aom_highbd_8_masked_sub_pixel_variance64x128;
      pcVar14 = aom_highbd_masked_sad64x128_bits8;
      pp_Var11 = &aom_highbd_8_masked_sub_pixel_variance128x64;
      pcVar12 = aom_highbd_masked_sad128x64_bits8;
      pp_Var6 = &aom_highbd_8_masked_sub_pixel_variance128x128;
      pcVar2 = aom_highbd_masked_sad128x128_bits8;
      pcVar3 = aom_highbd_sad64x128x3d_bits8;
      pcVar4 = aom_highbd_sad64x128x4d_bits8;
      pcVar7 = aom_highbd_8_sub_pixel_avg_variance64x128_c;
      local_3b0 = aom_highbd_8_sub_pixel_variance64x128_sse2;
    }
    ppi->fn_ptr[0xd].svf = (aom_subpixvariance_fn_t)local_3b0;
    ppi->fn_ptr[0xd].svaf = pcVar7;
    ppi->fn_ptr[0xd].sdx4df = pcVar4;
    ppi->fn_ptr[0xd].sdx3df = pcVar3;
    ppi->fn_ptr[0xf].msdf = pcVar2;
    ppi->fn_ptr[0xf].msvf = *pp_Var6;
    ppi->fn_ptr[0xe].msdf = pcVar12;
    ppi->fn_ptr[0xe].msvf = *pp_Var11;
    ppi->fn_ptr[0xd].msdf = pcVar14;
    ppi->fn_ptr[0xd].msvf = *pp_Var13;
    ppi->fn_ptr[0xc].msdf = pcVar5;
    ppi->fn_ptr[0xc].msvf = *pp_Var10;
    ppi->fn_ptr[0xb].msdf = pcVar9;
    ppi->fn_ptr[0xb].msvf = *pp_Var8;
    ppi->fn_ptr[10].msdf = local_448;
    ppi->fn_ptr[10].msvf = *local_440;
    ppi->fn_ptr[9].msdf = local_438;
    ppi->fn_ptr[9].msvf = *local_430;
    ppi->fn_ptr[8].msdf = local_428;
    ppi->fn_ptr[8].msvf = *local_420;
    ppi->fn_ptr[7].msdf = local_418;
    ppi->fn_ptr[7].msvf = *local_410;
    ppi->fn_ptr[6].msdf = local_408;
    ppi->fn_ptr[6].msvf = *local_400;
    ppi->fn_ptr[4].msdf = local_3f8;
    ppi->fn_ptr[4].msvf = *local_3f0;
    ppi->fn_ptr[5].msdf = local_3e8;
    ppi->fn_ptr[5].msvf = *local_3e0;
    ppi->fn_ptr[3].msdf = local_3d8;
    ppi->fn_ptr[3].msvf = *local_3d0;
    ppi->fn_ptr[1].msdf = local_3c8;
    ppi->fn_ptr[1].msvf = *local_3c0;
    ppi->fn_ptr[2].msdf = local_3b8;
    ppi->fn_ptr[2].msvf = *local_3a8;
    ppi->fn_ptr[0].msdf = local_3a0;
    ppi->fn_ptr[0].msvf = *local_398;
    ppi->fn_ptr[0x15].msdf = local_390;
    ppi->fn_ptr[0x15].msvf = *local_388;
    ppi->fn_ptr[0x14].msdf = local_380;
    ppi->fn_ptr[0x14].msvf = *local_378;
    ppi->fn_ptr[0x13].msdf = local_370;
    ppi->fn_ptr[0x13].msvf = *local_368;
    ppi->fn_ptr[0x12].msdf = local_360;
    ppi->fn_ptr[0x12].msvf = *local_358;
    ppi->fn_ptr[0x11].msdf = local_350;
    ppi->fn_ptr[0x11].msvf = *local_348;
    ppi->fn_ptr[0x10].msdf = local_340;
    ppi->fn_ptr[0x10].msvf = *local_338;
    ppi->fn_ptr[0xf].osdf = local_330;
    ppi->fn_ptr[0xf].ovf = *local_328;
    ppi->fn_ptr[0xf].osvf = local_320;
    ppi->fn_ptr[0xe].osdf = local_318;
    ppi->fn_ptr[0xe].ovf = *local_310;
    ppi->fn_ptr[0xe].osvf = local_308;
    ppi->fn_ptr[0xd].osdf = local_300;
    ppi->fn_ptr[0xd].ovf = *local_2f8;
    ppi->fn_ptr[0xd].osvf = local_2f0;
    ppi->fn_ptr[0xc].osdf = local_2e8;
    ppi->fn_ptr[0xc].ovf = *local_2e0;
    ppi->fn_ptr[0xc].osvf = local_2d8;
    ppi->fn_ptr[0xb].osdf = local_2d0;
    ppi->fn_ptr[0xb].ovf = *local_2c8;
    ppi->fn_ptr[0xb].osvf = local_2c0;
    ppi->fn_ptr[10].osdf = local_2b8;
    ppi->fn_ptr[10].ovf = *local_2b0;
    ppi->fn_ptr[10].osvf = local_2a8;
    ppi->fn_ptr[9].osdf = local_2a0;
    ppi->fn_ptr[9].ovf = *local_298;
    ppi->fn_ptr[9].osvf = local_290;
    ppi->fn_ptr[8].osdf = local_288;
    ppi->fn_ptr[8].ovf = *local_280;
    ppi->fn_ptr[8].osvf = local_278;
    ppi->fn_ptr[7].osdf = local_270;
    ppi->fn_ptr[7].ovf = *local_268;
    ppi->fn_ptr[7].osvf = local_260;
    ppi->fn_ptr[6].osdf = local_258;
    ppi->fn_ptr[6].ovf = *local_250;
    ppi->fn_ptr[6].osvf = local_248;
    ppi->fn_ptr[4].osdf = local_240;
    ppi->fn_ptr[4].ovf = *local_238;
    ppi->fn_ptr[4].osvf = local_230;
    ppi->fn_ptr[5].osdf = local_228;
    ppi->fn_ptr[5].ovf = *local_220;
    ppi->fn_ptr[5].osvf = local_218;
    ppi->fn_ptr[3].osdf = local_210;
    ppi->fn_ptr[3].ovf = *local_208;
    ppi->fn_ptr[3].osvf = local_200;
    ppi->fn_ptr[1].osdf = local_1f8;
    ppi->fn_ptr[1].ovf = *local_1f0;
    ppi->fn_ptr[1].osvf = local_1e8;
    ppi->fn_ptr[2].osdf = local_1e0;
    ppi->fn_ptr[2].ovf = *local_1d8;
    ppi->fn_ptr[2].osvf = local_1d0;
    ppi->fn_ptr[0].osdf = local_1c8;
    ppi->fn_ptr[0].ovf = *local_1c0;
    ppi->fn_ptr[0].osvf = local_1b8;
    ppi->fn_ptr[0x15].osdf = local_1b0;
    ppi->fn_ptr[0x15].ovf = *local_1a8;
    ppi->fn_ptr[0x15].osvf = local_1a0;
    ppi->fn_ptr[0x14].osdf = local_198;
    ppi->fn_ptr[0x14].ovf = *local_190;
    ppi->fn_ptr[0x14].osvf = local_188;
    ppi->fn_ptr[0x13].osdf = local_180;
    ppi->fn_ptr[0x13].ovf = *local_178;
    ppi->fn_ptr[0x13].osvf = local_170;
    ppi->fn_ptr[0x12].osdf = local_168;
    ppi->fn_ptr[0x12].ovf = *local_160;
    ppi->fn_ptr[0x12].osvf = local_158;
    ppi->fn_ptr[0x11].osdf = local_150;
    ppi->fn_ptr[0x11].ovf = *local_148;
    ppi->fn_ptr[0x11].osvf = local_140;
    ppi->fn_ptr[0x10].osdf = local_138;
    ppi->fn_ptr[0x10].ovf = *local_130;
    ppi->fn_ptr[0x10].osvf = local_128;
    ppi->fn_ptr[0xf].sdsf = local_120;
    ppi->fn_ptr[0xf].sdsx4df = local_118;
    ppi->fn_ptr[0xe].sdsf = local_110;
    ppi->fn_ptr[0xe].sdsx4df = local_108;
    ppi->fn_ptr[0xd].sdsf = local_100;
    ppi->fn_ptr[0xd].sdsx4df = local_f8;
    ppi->fn_ptr[0xc].sdsf = local_f0;
    ppi->fn_ptr[0xc].sdsx4df = local_e8;
    ppi->fn_ptr[0xb].sdsf = local_e0;
    ppi->fn_ptr[0xb].sdsx4df = local_d8;
    ppi->fn_ptr[10].sdsf = local_d0;
    ppi->fn_ptr[10].sdsx4df = local_c8;
    ppi->fn_ptr[9].sdsf = local_c0;
    ppi->fn_ptr[9].sdsx4df = local_b8;
    ppi->fn_ptr[8].sdsf = local_b0;
    ppi->fn_ptr[8].sdsx4df = local_a8;
    ppi->fn_ptr[7].sdsf = local_a0;
    ppi->fn_ptr[7].sdsx4df = local_98;
    ppi->fn_ptr[6].sdsf = local_90;
    ppi->fn_ptr[6].sdsx4df = local_88;
    ppi->fn_ptr[4].sdsf = local_80;
    ppi->fn_ptr[4].sdsx4df = local_78;
    ppi->fn_ptr[0x15].sdsf = local_70;
    ppi->fn_ptr[0x15].sdsx4df = local_68;
    ppi->fn_ptr[0x14].sdsf = local_60;
    ppi->fn_ptr[0x14].sdsx4df = local_58;
    ppi->fn_ptr[0x12].sdsf = local_50;
    ppi->fn_ptr[0x12].sdsx4df = local_48;
    ppi->fn_ptr[0x10].sdsf = local_40;
    ppi->fn_ptr[0x10].sdsx4df = local_38;
  }
  return;
}

Assistant:

static inline void highbd_set_var_fns(AV1_PRIMARY *const ppi) {
  SequenceHeader *const seq_params = &ppi->seq_params;
  if (seq_params->use_highbitdepth) {
    switch (seq_params->bit_depth) {
      case AOM_BITS_8:
#if !CONFIG_REALTIME_ONLY
        HIGHBD_BFP_WRAPPER(64, 16, 8)
        HIGHBD_BFP_WRAPPER(16, 64, 8)
        HIGHBD_BFP_WRAPPER(32, 8, 8)
        HIGHBD_BFP_WRAPPER(8, 32, 8)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(16, 4, 8)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 16, 8)
#endif
        HIGHBD_BFP_WRAPPER(32, 16, 8)
        HIGHBD_BFP_WRAPPER(16, 32, 8)
        HIGHBD_BFP_WRAPPER(64, 32, 8)
        HIGHBD_BFP_WRAPPER(32, 64, 8)
        HIGHBD_BFP_WRAPPER(32, 32, 8)
        HIGHBD_BFP_WRAPPER(64, 64, 8)
        HIGHBD_BFP_WRAPPER(16, 16, 8)
        HIGHBD_BFP_WRAPPER(16, 8, 8)
        HIGHBD_BFP_WRAPPER(8, 16, 8)
        HIGHBD_BFP_WRAPPER(8, 8, 8)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(8, 4, 8)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 8, 8)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 4, 8)
        HIGHBD_BFP_WRAPPER(128, 128, 8)
        HIGHBD_BFP_WRAPPER(128, 64, 8)
        HIGHBD_BFP_WRAPPER(64, 128, 8)

        HIGHBD_MBFP_WRAPPER(128, 128, 8)
        HIGHBD_MBFP_WRAPPER(128, 64, 8)
        HIGHBD_MBFP_WRAPPER(64, 128, 8)
        HIGHBD_MBFP_WRAPPER(64, 64, 8)
        HIGHBD_MBFP_WRAPPER(64, 32, 8)
        HIGHBD_MBFP_WRAPPER(32, 64, 8)
        HIGHBD_MBFP_WRAPPER(32, 32, 8)
        HIGHBD_MBFP_WRAPPER(32, 16, 8)
        HIGHBD_MBFP_WRAPPER(16, 32, 8)
        HIGHBD_MBFP_WRAPPER(16, 16, 8)
        HIGHBD_MBFP_WRAPPER(8, 16, 8)
        HIGHBD_MBFP_WRAPPER(16, 8, 8)
        HIGHBD_MBFP_WRAPPER(8, 8, 8)
        HIGHBD_MBFP_WRAPPER(4, 8, 8)
        HIGHBD_MBFP_WRAPPER(8, 4, 8)
        HIGHBD_MBFP_WRAPPER(4, 4, 8)
#if !CONFIG_REALTIME_ONLY
        HIGHBD_MBFP_WRAPPER(64, 16, 8)
        HIGHBD_MBFP_WRAPPER(16, 64, 8)
        HIGHBD_MBFP_WRAPPER(32, 8, 8)
        HIGHBD_MBFP_WRAPPER(8, 32, 8)
        HIGHBD_MBFP_WRAPPER(16, 4, 8)
        HIGHBD_MBFP_WRAPPER(4, 16, 8)
#endif

// OBMC excluded from realtime only build.
#if !CONFIG_REALTIME_ONLY
        HIGHBD_OBFP_WRAPPER_8(128, 128)
        HIGHBD_OBFP_WRAPPER_8(128, 64)
        HIGHBD_OBFP_WRAPPER_8(64, 128)
        HIGHBD_OBFP_WRAPPER_8(64, 64)
        HIGHBD_OBFP_WRAPPER_8(64, 32)
        HIGHBD_OBFP_WRAPPER_8(32, 64)
        HIGHBD_OBFP_WRAPPER_8(32, 32)
        HIGHBD_OBFP_WRAPPER_8(32, 16)
        HIGHBD_OBFP_WRAPPER_8(16, 32)
        HIGHBD_OBFP_WRAPPER_8(16, 16)
        HIGHBD_OBFP_WRAPPER_8(8, 16)
        HIGHBD_OBFP_WRAPPER_8(16, 8)
        HIGHBD_OBFP_WRAPPER_8(8, 8)
        HIGHBD_OBFP_WRAPPER_8(4, 8)
        HIGHBD_OBFP_WRAPPER_8(8, 4)
        HIGHBD_OBFP_WRAPPER_8(4, 4)
        HIGHBD_OBFP_WRAPPER_8(64, 16)
        HIGHBD_OBFP_WRAPPER_8(16, 64)
        HIGHBD_OBFP_WRAPPER_8(32, 8)
        HIGHBD_OBFP_WRAPPER_8(8, 32)
        HIGHBD_OBFP_WRAPPER_8(16, 4)
        HIGHBD_OBFP_WRAPPER_8(4, 16)
#endif

        HIGHBD_SDSFP_WRAPPER(128, 128, 8)
        HIGHBD_SDSFP_WRAPPER(128, 64, 8)
        HIGHBD_SDSFP_WRAPPER(64, 128, 8)
        HIGHBD_SDSFP_WRAPPER(64, 64, 8)
        HIGHBD_SDSFP_WRAPPER(64, 32, 8)
        HIGHBD_SDSFP_WRAPPER(32, 64, 8)
        HIGHBD_SDSFP_WRAPPER(32, 32, 8)
        HIGHBD_SDSFP_WRAPPER(32, 16, 8)
        HIGHBD_SDSFP_WRAPPER(16, 32, 8)
        HIGHBD_SDSFP_WRAPPER(16, 16, 8)
        HIGHBD_SDSFP_WRAPPER(8, 16, 8)
#if !CONFIG_REALTIME_ONLY
        HIGHBD_SDSFP_WRAPPER(64, 16, 8)
        HIGHBD_SDSFP_WRAPPER(16, 64, 8)
        HIGHBD_SDSFP_WRAPPER(8, 32, 8)
        HIGHBD_SDSFP_WRAPPER(4, 16, 8)
#endif
        break;

      case AOM_BITS_10:
#if !CONFIG_REALTIME_ONLY
        HIGHBD_BFP_WRAPPER(64, 16, 10)
        HIGHBD_BFP_WRAPPER(16, 64, 10)
        HIGHBD_BFP_WRAPPER(32, 8, 10)
        HIGHBD_BFP_WRAPPER(8, 32, 10)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(16, 4, 10)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 16, 10)
#endif
        HIGHBD_BFP_WRAPPER(32, 16, 10)
        HIGHBD_BFP_WRAPPER(16, 32, 10)
        HIGHBD_BFP_WRAPPER(64, 32, 10)
        HIGHBD_BFP_WRAPPER(32, 64, 10)
        HIGHBD_BFP_WRAPPER(32, 32, 10)
        HIGHBD_BFP_WRAPPER(64, 64, 10)
        HIGHBD_BFP_WRAPPER(16, 16, 10)
        HIGHBD_BFP_WRAPPER(16, 8, 10)
        HIGHBD_BFP_WRAPPER(8, 16, 10)
        HIGHBD_BFP_WRAPPER(8, 8, 10)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(8, 4, 10)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 8, 10)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 4, 10)
        HIGHBD_BFP_WRAPPER(128, 128, 10)
        HIGHBD_BFP_WRAPPER(128, 64, 10)
        HIGHBD_BFP_WRAPPER(64, 128, 10)

        HIGHBD_MBFP_WRAPPER(128, 128, 10)
        HIGHBD_MBFP_WRAPPER(128, 64, 10)
        HIGHBD_MBFP_WRAPPER(64, 128, 10)
        HIGHBD_MBFP_WRAPPER(64, 64, 10)
        HIGHBD_MBFP_WRAPPER(64, 32, 10)
        HIGHBD_MBFP_WRAPPER(32, 64, 10)
        HIGHBD_MBFP_WRAPPER(32, 32, 10)
        HIGHBD_MBFP_WRAPPER(32, 16, 10)
        HIGHBD_MBFP_WRAPPER(16, 32, 10)
        HIGHBD_MBFP_WRAPPER(16, 16, 10)
        HIGHBD_MBFP_WRAPPER(8, 16, 10)
        HIGHBD_MBFP_WRAPPER(16, 8, 10)
        HIGHBD_MBFP_WRAPPER(8, 8, 10)
        HIGHBD_MBFP_WRAPPER(4, 8, 10)
        HIGHBD_MBFP_WRAPPER(8, 4, 10)
        HIGHBD_MBFP_WRAPPER(4, 4, 10)
#if !CONFIG_REALTIME_ONLY
        HIGHBD_MBFP_WRAPPER(64, 16, 10)
        HIGHBD_MBFP_WRAPPER(16, 64, 10)
        HIGHBD_MBFP_WRAPPER(32, 8, 10)
        HIGHBD_MBFP_WRAPPER(8, 32, 10)
        HIGHBD_MBFP_WRAPPER(16, 4, 10)
        HIGHBD_MBFP_WRAPPER(4, 16, 10)
#endif

// OBMC excluded from realtime only build.
#if !CONFIG_REALTIME_ONLY
        HIGHBD_OBFP_WRAPPER(128, 128, 10)
        HIGHBD_OBFP_WRAPPER(128, 64, 10)
        HIGHBD_OBFP_WRAPPER(64, 128, 10)
        HIGHBD_OBFP_WRAPPER(64, 64, 10)
        HIGHBD_OBFP_WRAPPER(64, 32, 10)
        HIGHBD_OBFP_WRAPPER(32, 64, 10)
        HIGHBD_OBFP_WRAPPER(32, 32, 10)
        HIGHBD_OBFP_WRAPPER(32, 16, 10)
        HIGHBD_OBFP_WRAPPER(16, 32, 10)
        HIGHBD_OBFP_WRAPPER(16, 16, 10)
        HIGHBD_OBFP_WRAPPER(8, 16, 10)
        HIGHBD_OBFP_WRAPPER(16, 8, 10)
        HIGHBD_OBFP_WRAPPER(8, 8, 10)
        HIGHBD_OBFP_WRAPPER(4, 8, 10)
        HIGHBD_OBFP_WRAPPER(8, 4, 10)
        HIGHBD_OBFP_WRAPPER(4, 4, 10)
        HIGHBD_OBFP_WRAPPER(64, 16, 10)
        HIGHBD_OBFP_WRAPPER(16, 64, 10)
        HIGHBD_OBFP_WRAPPER(32, 8, 10)
        HIGHBD_OBFP_WRAPPER(8, 32, 10)
        HIGHBD_OBFP_WRAPPER(16, 4, 10)
        HIGHBD_OBFP_WRAPPER(4, 16, 10)
#endif

        HIGHBD_SDSFP_WRAPPER(128, 128, 10)
        HIGHBD_SDSFP_WRAPPER(128, 64, 10)
        HIGHBD_SDSFP_WRAPPER(64, 128, 10)
        HIGHBD_SDSFP_WRAPPER(64, 64, 10)
        HIGHBD_SDSFP_WRAPPER(64, 32, 10)
        HIGHBD_SDSFP_WRAPPER(32, 64, 10)
        HIGHBD_SDSFP_WRAPPER(32, 32, 10)
        HIGHBD_SDSFP_WRAPPER(32, 16, 10)
        HIGHBD_SDSFP_WRAPPER(16, 32, 10)
        HIGHBD_SDSFP_WRAPPER(16, 16, 10)
        HIGHBD_SDSFP_WRAPPER(8, 16, 10)

#if !CONFIG_REALTIME_ONLY
        HIGHBD_SDSFP_WRAPPER(64, 16, 10)
        HIGHBD_SDSFP_WRAPPER(16, 64, 10)
        HIGHBD_SDSFP_WRAPPER(8, 32, 10)
        HIGHBD_SDSFP_WRAPPER(4, 16, 10)
#endif
        break;

      case AOM_BITS_12:
#if !CONFIG_REALTIME_ONLY
        HIGHBD_BFP_WRAPPER(64, 16, 12)
        HIGHBD_BFP_WRAPPER(16, 64, 12)
        HIGHBD_BFP_WRAPPER(32, 8, 12)
        HIGHBD_BFP_WRAPPER(8, 32, 12)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(16, 4, 12)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 16, 12)
#endif
        HIGHBD_BFP_WRAPPER(32, 16, 12)
        HIGHBD_BFP_WRAPPER(16, 32, 12)
        HIGHBD_BFP_WRAPPER(64, 32, 12)
        HIGHBD_BFP_WRAPPER(32, 64, 12)
        HIGHBD_BFP_WRAPPER(32, 32, 12)
        HIGHBD_BFP_WRAPPER(64, 64, 12)
        HIGHBD_BFP_WRAPPER(16, 16, 12)
        HIGHBD_BFP_WRAPPER(16, 8, 12)
        HIGHBD_BFP_WRAPPER(8, 16, 12)
        HIGHBD_BFP_WRAPPER(8, 8, 12)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(8, 4, 12)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 8, 12)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 4, 12)
        HIGHBD_BFP_WRAPPER(128, 128, 12)
        HIGHBD_BFP_WRAPPER(128, 64, 12)
        HIGHBD_BFP_WRAPPER(64, 128, 12)

        HIGHBD_MBFP_WRAPPER(128, 128, 12)
        HIGHBD_MBFP_WRAPPER(128, 64, 12)
        HIGHBD_MBFP_WRAPPER(64, 128, 12)
        HIGHBD_MBFP_WRAPPER(64, 64, 12)
        HIGHBD_MBFP_WRAPPER(64, 32, 12)
        HIGHBD_MBFP_WRAPPER(32, 64, 12)
        HIGHBD_MBFP_WRAPPER(32, 32, 12)
        HIGHBD_MBFP_WRAPPER(32, 16, 12)
        HIGHBD_MBFP_WRAPPER(16, 32, 12)
        HIGHBD_MBFP_WRAPPER(16, 16, 12)
        HIGHBD_MBFP_WRAPPER(8, 16, 12)
        HIGHBD_MBFP_WRAPPER(16, 8, 12)
        HIGHBD_MBFP_WRAPPER(8, 8, 12)
        HIGHBD_MBFP_WRAPPER(4, 8, 12)
        HIGHBD_MBFP_WRAPPER(8, 4, 12)
        HIGHBD_MBFP_WRAPPER(4, 4, 12)
#if !CONFIG_REALTIME_ONLY
        HIGHBD_MBFP_WRAPPER(64, 16, 12)
        HIGHBD_MBFP_WRAPPER(16, 64, 12)
        HIGHBD_MBFP_WRAPPER(32, 8, 12)
        HIGHBD_MBFP_WRAPPER(8, 32, 12)
        HIGHBD_MBFP_WRAPPER(16, 4, 12)
        HIGHBD_MBFP_WRAPPER(4, 16, 12)
#endif

// OBMC excluded from realtime only build.
#if !CONFIG_REALTIME_ONLY
        HIGHBD_OBFP_WRAPPER(128, 128, 12)
        HIGHBD_OBFP_WRAPPER(128, 64, 12)
        HIGHBD_OBFP_WRAPPER(64, 128, 12)
        HIGHBD_OBFP_WRAPPER(64, 64, 12)
        HIGHBD_OBFP_WRAPPER(64, 32, 12)
        HIGHBD_OBFP_WRAPPER(32, 64, 12)
        HIGHBD_OBFP_WRAPPER(32, 32, 12)
        HIGHBD_OBFP_WRAPPER(32, 16, 12)
        HIGHBD_OBFP_WRAPPER(16, 32, 12)
        HIGHBD_OBFP_WRAPPER(16, 16, 12)
        HIGHBD_OBFP_WRAPPER(8, 16, 12)
        HIGHBD_OBFP_WRAPPER(16, 8, 12)
        HIGHBD_OBFP_WRAPPER(8, 8, 12)
        HIGHBD_OBFP_WRAPPER(4, 8, 12)
        HIGHBD_OBFP_WRAPPER(8, 4, 12)
        HIGHBD_OBFP_WRAPPER(4, 4, 12)
        HIGHBD_OBFP_WRAPPER(64, 16, 12)
        HIGHBD_OBFP_WRAPPER(16, 64, 12)
        HIGHBD_OBFP_WRAPPER(32, 8, 12)
        HIGHBD_OBFP_WRAPPER(8, 32, 12)
        HIGHBD_OBFP_WRAPPER(16, 4, 12)
        HIGHBD_OBFP_WRAPPER(4, 16, 12)
#endif

        HIGHBD_SDSFP_WRAPPER(128, 128, 12)
        HIGHBD_SDSFP_WRAPPER(128, 64, 12)
        HIGHBD_SDSFP_WRAPPER(64, 128, 12)
        HIGHBD_SDSFP_WRAPPER(64, 64, 12)
        HIGHBD_SDSFP_WRAPPER(64, 32, 12)
        HIGHBD_SDSFP_WRAPPER(32, 64, 12)
        HIGHBD_SDSFP_WRAPPER(32, 32, 12)
        HIGHBD_SDSFP_WRAPPER(32, 16, 12)
        HIGHBD_SDSFP_WRAPPER(16, 32, 12)
        HIGHBD_SDSFP_WRAPPER(16, 16, 12)
        HIGHBD_SDSFP_WRAPPER(8, 16, 12)

#if !CONFIG_REALTIME_ONLY
        HIGHBD_SDSFP_WRAPPER(64, 16, 12)
        HIGHBD_SDSFP_WRAPPER(16, 64, 12)
        HIGHBD_SDSFP_WRAPPER(8, 32, 12)
        HIGHBD_SDSFP_WRAPPER(4, 16, 12)
#endif
        break;

      default:
        assert(0 &&
               "cm->seq_params->bit_depth should be AOM_BITS_8, "
               "AOM_BITS_10 or AOM_BITS_12");
    }
  }
}